

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O1

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
       *this,vboolf_impl<4> *valid,Ref This,vfloat_impl<4> *u,vfloat_impl<4> *v,float dscale,
      size_t depth)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  vfloat_impl<4> *ptr;
  uint uVar14;
  uint uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  size_t i_2;
  float *pfVar18;
  uint *puVar19;
  long lVar20;
  size_t extraout_RDX;
  ulong uVar22;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  long lVar23;
  long lVar24;
  size_t sVar25;
  DynamicStackArray<float,_16UL,_64UL> *pDVar26;
  uint *puVar27;
  uint *puVar28;
  uint *puVar29;
  uint *puVar30;
  size_t i;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  uint *puVar35;
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar41;
  undefined1 auVar37 [16];
  float *pfVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar62;
  float fVar64;
  undefined1 auVar63 [16];
  float fVar65;
  float fVar66;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar92;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar98;
  float fVar108;
  undefined1 in_XMM7 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar109;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar110;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar117;
  float fVar119;
  undefined1 in_XMM8 [16];
  float fVar122;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar125;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 in_XMM9 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  uint uVar136;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar143;
  float fVar148;
  float fVar149;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  vboolf_impl<4> vVar157;
  size_t in_stack_00000008;
  CatmullClarkPatch patch;
  anon_union_32_2_4062524c_for_Vec2<embree::vfloat_impl<4>_>_1 local_de0;
  FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_dc0;
  CatmullClarkPatch local_d80;
  Ref RVar21;
  
  RVar21.ptr = This.ptr;
  if (u == (vfloat_impl<4> *)0x0) {
switchD_00e32e6c_caseD_5:
    pfVar18 = (float *)mm_lookupmask_ps._0_8_;
    pfVar40 = (float *)mm_lookupmask_ps._8_8_;
    goto LAB_00e3588a;
  }
  RVar21.ptr = in_stack_00000008;
  switch((uint)u & 0xf) {
  case 1:
    uVar22 = (ulong)u & 0xfffffffffffffff0;
    puVar30 = *(uint **)&valid->field_0;
    lVar20 = *(long *)((long)&valid->field_0 + 8);
    lVar24 = *(long *)&valid[1].field_0;
    lVar32 = *(long *)((long)&valid[1].field_0 + 8);
    lVar33 = *(long *)&valid[2].field_0;
    RVar21.ptr = *(size_t *)((long)&valid[2].field_0 + 8);
    lVar12 = *(long *)&valid[3].field_0;
    lVar13 = *(long *)((long)&valid[3].field_0 + 8);
    if (lVar13 != 0 && puVar30 != (uint *)0x0) {
      lVar23 = 0;
      do {
        fVar112 = *(float *)(uVar22 + lVar23 * 4);
        fVar118 = *(float *)(uVar22 + 0x10 + lVar23 * 4) - fVar112;
        fVar120 = (v->field_0).v[1];
        fVar124 = (v->field_0).v[2];
        fVar76 = (v->field_0).v[3];
        fVar36 = fVar118 * (v->field_0).v[0] + fVar112;
        fVar38 = fVar118 * fVar120 + fVar112;
        fVar39 = fVar118 * fVar124 + fVar112;
        fVar112 = fVar118 * fVar76 + fVar112;
        fVar118 = *(float *)(uVar22 + 0x30 + lVar23 * 4);
        fVar41 = *(float *)(uVar22 + 0x20 + lVar23 * 4) - fVar118;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        *puVar30 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)(((fVar41 * (v->field_0).v[0] + fVar118) - fVar36) * *(float *)depth +
                         fVar36) & *(uint *)This.ptr;
        puVar30[1] = ~uVar11 & puVar30[1] |
                     (uint)(((fVar41 * fVar120 + fVar118) - fVar38) * fVar82 + fVar38) & uVar11;
        puVar30[2] = ~uVar14 & puVar30[2] |
                     (uint)(((fVar41 * fVar124 + fVar118) - fVar39) * fVar86 + fVar39) & uVar14;
        puVar30[3] = ~uVar15 & puVar30[3] |
                     (uint)(((fVar41 * fVar76 + fVar118) - fVar112) * fVar90 + fVar112) & uVar15;
        lVar23 = lVar23 + 1;
        puVar30 = puVar30 + lVar12;
      } while (lVar13 != lVar23);
    }
    if (lVar13 != 0 && lVar20 != 0) {
      lVar23 = 0;
      lVar31 = 0;
      do {
        fVar124 = *(float *)(uVar22 + 0x10 + lVar31 * 4) - *(float *)(uVar22 + lVar31 * 4);
        fVar76 = (*(float *)(uVar22 + 0x20 + lVar31 * 4) - *(float *)(uVar22 + 0x30 + lVar31 * 4)) -
                 fVar124;
        fVar112 = *(float *)(depth + 4);
        fVar118 = *(float *)(depth + 8);
        fVar120 = *(float *)(depth + 0xc);
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        puVar30 = (uint *)(lVar20 + lVar23 * 4);
        uVar136 = puVar30[1];
        uVar140 = puVar30[2];
        uVar141 = puVar30[3];
        puVar29 = (uint *)(lVar20 + lVar23 * 4);
        *puVar29 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)((fVar76 * *(float *)depth + fVar124) * dscale) & *(uint *)This.ptr;
        puVar29[1] = ~uVar11 & uVar136 | (uint)((fVar76 * fVar112 + fVar124) * dscale) & uVar11;
        puVar29[2] = ~uVar14 & uVar140 | (uint)((fVar76 * fVar118 + fVar124) * dscale) & uVar14;
        puVar29[3] = ~uVar15 & uVar141 | (uint)((fVar76 * fVar120 + fVar124) * dscale) & uVar15;
        fVar76 = *(float *)(uVar22 + 0x30 + lVar31 * 4) - *(float *)(uVar22 + lVar31 * 4);
        fVar124 = (*(float *)(uVar22 + 0x20 + lVar31 * 4) - *(float *)(uVar22 + 0x10 + lVar31 * 4))
                  - fVar76;
        fVar112 = (v->field_0).v[1];
        fVar118 = (v->field_0).v[2];
        fVar120 = (v->field_0).v[3];
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        puVar30 = (uint *)(lVar24 + lVar23 * 4);
        uVar136 = puVar30[1];
        uVar140 = puVar30[2];
        uVar141 = puVar30[3];
        puVar29 = (uint *)(lVar24 + lVar23 * 4);
        *puVar29 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)((fVar124 * (v->field_0).v[0] + fVar76) * dscale) & *(uint *)This.ptr;
        puVar29[1] = ~uVar11 & uVar136 | (uint)((fVar124 * fVar112 + fVar76) * dscale) & uVar11;
        puVar29[2] = ~uVar14 & uVar140 | (uint)((fVar124 * fVar118 + fVar76) * dscale) & uVar14;
        puVar29[3] = ~uVar15 & uVar141 | (uint)((fVar124 * fVar120 + fVar76) * dscale) & uVar15;
        lVar31 = lVar31 + 1;
        lVar23 = lVar23 + lVar12;
      } while (lVar13 != lVar31);
    }
    if (lVar13 != 0 && lVar32 != 0) {
      fVar112 = dscale * dscale * 0.0;
      lVar20 = 0;
      lVar24 = 0;
      do {
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        puVar30 = (uint *)(lVar32 + lVar20 * 4);
        uVar136 = puVar30[1];
        uVar140 = puVar30[2];
        uVar141 = puVar30[3];
        puVar29 = (uint *)(lVar32 + lVar20 * 4);
        *puVar29 = ~*(uint *)This.ptr & *puVar30 | *(uint *)This.ptr & (uint)fVar112;
        puVar29[1] = ~uVar11 & uVar136 | uVar11 & (uint)fVar112;
        puVar29[2] = ~uVar14 & uVar140 | uVar14 & (uint)fVar112;
        puVar29[3] = ~uVar15 & uVar141 | uVar15 & (uint)fVar112;
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        puVar30 = (uint *)(lVar33 + lVar20 * 4);
        uVar136 = puVar30[1];
        uVar140 = puVar30[2];
        uVar141 = puVar30[3];
        puVar29 = (uint *)(lVar33 + lVar20 * 4);
        *puVar29 = ~*(uint *)This.ptr & *puVar30 | *(uint *)This.ptr & (uint)fVar112;
        puVar29[1] = ~uVar11 & uVar136 | uVar11 & (uint)fVar112;
        puVar29[2] = ~uVar14 & uVar140 | uVar14 & (uint)fVar112;
        puVar29[3] = ~uVar15 & uVar141 | uVar15 & (uint)fVar112;
        fVar118 = ((*(float *)(uVar22 + 0x20 + lVar24 * 4) - *(float *)(uVar22 + 0x30 + lVar24 * 4))
                  - (*(float *)(uVar22 + 0x10 + lVar24 * 4) - *(float *)(uVar22 + lVar24 * 4))) *
                  dscale * dscale;
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        puVar30 = (uint *)(RVar21.ptr + lVar20 * 4);
        uVar136 = puVar30[1];
        uVar140 = puVar30[2];
        uVar141 = puVar30[3];
        puVar29 = (uint *)(RVar21.ptr + lVar20 * 4);
        *puVar29 = ~*(uint *)This.ptr & *puVar30 | (uint)fVar118 & *(uint *)This.ptr;
        puVar29[1] = ~uVar11 & uVar136 | (uint)fVar118 & uVar11;
        puVar29[2] = ~uVar14 & uVar140 | (uint)fVar118 & uVar14;
        puVar29[3] = ~uVar15 & uVar141 | (uint)fVar118 & uVar15;
        lVar24 = lVar24 + 1;
        lVar20 = lVar20 + lVar12;
      } while (lVar13 != lVar24);
    }
    goto LAB_00e33102;
  case 2:
    BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
    eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
              ((BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *)
               ((ulong)u & 0xfffffffffffffff0),(vboolf_impl<4> *)This.ptr,v,(vfloat_impl<4> *)depth,
               *(float **)&valid->field_0,*(float **)((long)&valid->field_0 + 8),
               *(float **)&valid[1].field_0,*(float **)((long)&valid[1].field_0 + 8),
               *(float **)&valid[2].field_0,*(float **)((long)&valid[2].field_0 + 8),dscale,
               *(size_t *)&valid[3].field_0,*(size_t *)((long)&valid[3].field_0 + 8));
    RVar21.ptr = extraout_RDX;
LAB_00e33102:
    pfVar18 = *(float **)This.ptr;
    pfVar40 = *(float **)(This.ptr + 8);
LAB_00e3588a:
    this->P = pfVar18;
    this->dPdu = pfVar40;
    break;
  case 3:
    uVar22 = (ulong)u & 0xfffffffffffffff0;
    puVar30 = *(uint **)&valid->field_0;
    puVar29 = *(uint **)((long)&valid->field_0 + 8);
    puVar28 = *(uint **)&valid[1].field_0;
    puVar27 = *(uint **)((long)&valid[1].field_0 + 8);
    puVar35 = *(uint **)&valid[2].field_0;
    puVar19 = *(uint **)((long)&valid[2].field_0 + 8);
    lVar20 = *(long *)&valid[3].field_0;
    RVar21.ptr = *(size_t *)((long)&valid[3].field_0 + 8);
    if ((puVar30 != (uint *)0x0) && (RVar21.ptr != 0)) {
      fVar112 = (v->field_0).v[0];
      fVar118 = (v->field_0).v[1];
      fVar120 = (v->field_0).v[2];
      fVar124 = (v->field_0).v[3];
      fVar42 = 1.0 - fVar112;
      fVar46 = 1.0 - fVar118;
      fVar50 = 1.0 - fVar120;
      fVar58 = 1.0 - fVar124;
      fVar76 = *(float *)depth;
      fVar82 = *(float *)(depth + 4);
      fVar86 = *(float *)(depth + 8);
      fVar90 = *(float *)(depth + 0xc);
      fVar65 = 1.0 - fVar76;
      fVar69 = 1.0 - fVar82;
      fVar70 = 1.0 - fVar86;
      fVar73 = 1.0 - fVar90;
      fVar36 = fVar76 * fVar76 * 3.0 * fVar65;
      fVar38 = fVar82 * fVar82 * 3.0 * fVar69;
      fVar39 = fVar86 * fVar86 * 3.0 * fVar70;
      fVar41 = fVar90 * fVar90 * 3.0 * fVar73;
      fVar44 = fVar65 * fVar65 * fVar65;
      fVar48 = fVar69 * fVar69 * fVar69;
      fVar56 = fVar70 * fVar70 * fVar70;
      fVar60 = fVar73 * fVar73 * fVar73;
      fVar65 = fVar76 * 3.0 * fVar65 * fVar65;
      fVar69 = fVar82 * 3.0 * fVar69 * fVar69;
      fVar70 = fVar86 * 3.0 * fVar70 * fVar70;
      fVar73 = fVar90 * 3.0 * fVar73 * fVar73;
      fVar76 = fVar76 * fVar76 * fVar76;
      fVar82 = fVar82 * fVar82 * fVar82;
      fVar86 = fVar86 * fVar86 * fVar86;
      fVar90 = fVar90 * fVar90 * fVar90;
      sVar25 = 0;
      do {
        fVar78 = *(float *)(uVar22 + sVar25 * 4);
        fVar79 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
        fVar84 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
        fVar85 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
        fVar88 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
        fVar89 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
        fVar43 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
        fVar45 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
        fVar47 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
        fVar49 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
        fVar77 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
        fVar83 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
        fVar87 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
        fVar91 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
        fVar123 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
        fVar2 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        *puVar30 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)((fVar2 * fVar76 + fVar123 * fVar36 + fVar91 * fVar65 + fVar85 * fVar44) *
                          fVar112 * fVar112 * fVar112 +
                         (fVar87 * fVar76 + fVar83 * fVar36 + fVar47 * fVar65 + fVar84 * fVar44) *
                         fVar112 * fVar112 * 3.0 * fVar42 +
                         (fVar77 * fVar76 + fVar49 * fVar36 + fVar45 * fVar65 + fVar79 * fVar44) *
                         fVar112 * 3.0 * fVar42 * fVar42 +
                         (fVar43 * fVar76 + fVar89 * fVar36 + fVar88 * fVar65 + fVar78 * fVar44) *
                         fVar42 * fVar42 * fVar42) & *(uint *)This.ptr;
        puVar30[1] = ~uVar11 & puVar30[1] |
                     (uint)((fVar2 * fVar82 + fVar123 * fVar38 + fVar91 * fVar69 + fVar85 * fVar48)
                            * fVar118 * fVar118 * fVar118 +
                           (fVar87 * fVar82 + fVar83 * fVar38 + fVar47 * fVar69 + fVar84 * fVar48) *
                           fVar118 * fVar118 * 3.0 * fVar46 +
                           (fVar77 * fVar82 + fVar49 * fVar38 + fVar45 * fVar69 + fVar79 * fVar48) *
                           fVar118 * 3.0 * fVar46 * fVar46 +
                           (fVar43 * fVar82 + fVar89 * fVar38 + fVar88 * fVar69 + fVar78 * fVar48) *
                           fVar46 * fVar46 * fVar46) & uVar11;
        puVar30[2] = ~uVar14 & puVar30[2] |
                     (uint)((fVar2 * fVar86 + fVar123 * fVar39 + fVar91 * fVar70 + fVar85 * fVar56)
                            * fVar120 * fVar120 * fVar120 +
                           (fVar87 * fVar86 + fVar83 * fVar39 + fVar47 * fVar70 + fVar84 * fVar56) *
                           fVar120 * fVar120 * 3.0 * fVar50 +
                           (fVar77 * fVar86 + fVar49 * fVar39 + fVar45 * fVar70 + fVar79 * fVar56) *
                           fVar120 * 3.0 * fVar50 * fVar50 +
                           (fVar43 * fVar86 + fVar89 * fVar39 + fVar88 * fVar70 + fVar78 * fVar56) *
                           fVar50 * fVar50 * fVar50) & uVar14;
        puVar30[3] = ~uVar15 & puVar30[3] |
                     (uint)((fVar2 * fVar90 + fVar123 * fVar41 + fVar91 * fVar73 + fVar85 * fVar60)
                            * fVar124 * fVar124 * fVar124 +
                           (fVar87 * fVar90 + fVar83 * fVar41 + fVar47 * fVar73 + fVar84 * fVar60) *
                           fVar124 * fVar124 * 3.0 * fVar58 +
                           (fVar77 * fVar90 + fVar49 * fVar41 + fVar45 * fVar73 + fVar79 * fVar60) *
                           fVar124 * 3.0 * fVar58 * fVar58 +
                           (fVar43 * fVar90 + fVar89 * fVar41 + fVar88 * fVar73 + fVar78 * fVar60) *
                           fVar58 * fVar58 * fVar58) & uVar15;
        sVar25 = sVar25 + 1;
        puVar30 = puVar30 + lVar20;
      } while (RVar21.ptr != sVar25);
    }
    if (puVar29 != (uint *)0x0) {
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar42 = 1.0 - fVar112;
        fVar44 = 1.0 - fVar118;
        fVar46 = 1.0 - fVar120;
        fVar48 = 1.0 - fVar124;
        fVar50 = fVar112 * fVar42 + fVar112 * fVar42;
        fVar56 = fVar118 * fVar44 + fVar118 * fVar44;
        fVar58 = fVar120 * fVar46 + fVar120 * fVar46;
        fVar60 = fVar124 * fVar48 + fVar124 * fVar48;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = 1.0 - fVar76;
        fVar38 = 1.0 - fVar82;
        fVar39 = 1.0 - fVar86;
        fVar41 = 1.0 - fVar90;
        fVar65 = fVar76 * fVar76 * fVar76;
        fVar69 = fVar82 * fVar82 * fVar82;
        fVar70 = fVar86 * fVar86 * fVar86;
        fVar73 = fVar90 * fVar90 * fVar90;
        fVar88 = fVar76 * fVar76 * 3.0 * fVar36;
        fVar89 = fVar82 * fVar82 * 3.0 * fVar38;
        fVar43 = fVar86 * fVar86 * 3.0 * fVar39;
        fVar45 = fVar90 * fVar90 * 3.0 * fVar41;
        fVar78 = fVar36 * fVar36 * fVar36;
        fVar79 = fVar38 * fVar38 * fVar38;
        fVar84 = fVar39 * fVar39 * fVar39;
        fVar85 = fVar41 * fVar41 * fVar41;
        fVar76 = fVar76 * 3.0 * fVar36 * fVar36;
        fVar82 = fVar82 * 3.0 * fVar38 * fVar38;
        fVar86 = fVar86 * 3.0 * fVar39 * fVar39;
        fVar90 = fVar90 * 3.0 * fVar41 * fVar41;
        sVar25 = 0;
        do {
          fVar36 = *(float *)(uVar22 + sVar25 * 4);
          fVar38 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar39 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar41 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar5 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar6 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar29 = ~*(uint *)This.ptr & *puVar29 |
                     (uint)(((fVar6 * fVar65 + fVar5 * fVar88 + fVar4 * fVar76 + fVar41 * fVar78) *
                             fVar112 * fVar112 * 3.0 +
                            (fVar3 * fVar65 + fVar123 * fVar88 + fVar83 * fVar76 + fVar39 * fVar78)
                            * (fVar50 - fVar112 * fVar112) * 3.0 +
                            ((fVar2 * fVar65 + fVar91 * fVar88 + fVar77 * fVar76 + fVar38 * fVar78)
                             * (fVar42 * fVar42 - fVar50) * 3.0 -
                            (fVar87 * fVar65 + fVar49 * fVar88 + fVar47 * fVar76 + fVar36 * fVar78)
                            * fVar42 * fVar42 * 3.0)) * dscale) & *(uint *)This.ptr;
          puVar29[1] = ~uVar11 & puVar29[1] |
                       (uint)(((fVar6 * fVar69 + fVar5 * fVar89 + fVar4 * fVar82 + fVar41 * fVar79)
                               * fVar118 * fVar118 * 3.0 +
                              (fVar3 * fVar69 + fVar123 * fVar89 + fVar83 * fVar82 + fVar39 * fVar79
                              ) * (fVar56 - fVar118 * fVar118) * 3.0 +
                              ((fVar2 * fVar69 + fVar91 * fVar89 + fVar77 * fVar82 + fVar38 * fVar79
                               ) * (fVar44 * fVar44 - fVar56) * 3.0 -
                              (fVar87 * fVar69 + fVar49 * fVar89 + fVar47 * fVar82 + fVar36 * fVar79
                              ) * fVar44 * fVar44 * 3.0)) * dscale) & uVar11;
          puVar29[2] = ~uVar14 & puVar29[2] |
                       (uint)(((fVar6 * fVar70 + fVar5 * fVar43 + fVar4 * fVar86 + fVar41 * fVar84)
                               * fVar120 * fVar120 * 3.0 +
                              (fVar3 * fVar70 + fVar123 * fVar43 + fVar83 * fVar86 + fVar39 * fVar84
                              ) * (fVar58 - fVar120 * fVar120) * 3.0 +
                              ((fVar2 * fVar70 + fVar91 * fVar43 + fVar77 * fVar86 + fVar38 * fVar84
                               ) * (fVar46 * fVar46 - fVar58) * 3.0 -
                              (fVar87 * fVar70 + fVar49 * fVar43 + fVar47 * fVar86 + fVar36 * fVar84
                              ) * fVar46 * fVar46 * 3.0)) * dscale) & uVar14;
          puVar29[3] = ~uVar15 & puVar29[3] |
                       (uint)(((fVar6 * fVar73 + fVar5 * fVar45 + fVar4 * fVar90 + fVar41 * fVar85)
                               * fVar124 * fVar124 * 3.0 +
                              (fVar3 * fVar73 + fVar123 * fVar45 + fVar83 * fVar90 + fVar39 * fVar85
                              ) * (fVar60 - fVar124 * fVar124) * 3.0 +
                              ((fVar2 * fVar73 + fVar91 * fVar45 + fVar77 * fVar90 + fVar38 * fVar85
                               ) * (fVar48 * fVar48 - fVar60) * 3.0 -
                              (fVar87 * fVar73 + fVar49 * fVar45 + fVar47 * fVar90 + fVar36 * fVar85
                              ) * fVar48 * fVar48 * 3.0)) * dscale) & uVar15;
          sVar25 = sVar25 + 1;
          puVar29 = puVar29 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar50 = 1.0 - fVar112;
        fVar56 = 1.0 - fVar118;
        fVar58 = 1.0 - fVar120;
        fVar60 = 1.0 - fVar124;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = 1.0 - fVar76;
        fVar39 = 1.0 - fVar82;
        fVar42 = 1.0 - fVar86;
        fVar46 = 1.0 - fVar90;
        fVar65 = fVar76 * fVar36 + fVar76 * fVar36;
        fVar69 = fVar82 * fVar39 + fVar82 * fVar39;
        fVar70 = fVar86 * fVar42 + fVar86 * fVar42;
        fVar73 = fVar90 * fVar46 + fVar90 * fVar46;
        fVar38 = fVar36 * fVar36 * -3.0;
        fVar41 = fVar39 * fVar39 * -3.0;
        fVar44 = fVar42 * fVar42 * -3.0;
        fVar48 = fVar46 * fVar46 * -3.0;
        fVar78 = (fVar36 * fVar36 - fVar65) * 3.0;
        fVar79 = (fVar39 * fVar39 - fVar69) * 3.0;
        fVar84 = (fVar42 * fVar42 - fVar70) * 3.0;
        fVar85 = (fVar46 * fVar46 - fVar73) * 3.0;
        fVar36 = (fVar65 - fVar76 * fVar76) * 3.0;
        fVar39 = (fVar69 - fVar82 * fVar82) * 3.0;
        fVar42 = (fVar70 - fVar86 * fVar86) * 3.0;
        fVar46 = (fVar73 - fVar90 * fVar90) * 3.0;
        fVar76 = fVar76 * fVar76 * 3.0;
        fVar82 = fVar82 * fVar82 * 3.0;
        fVar86 = fVar86 * fVar86 * 3.0;
        fVar90 = fVar90 * fVar90 * 3.0;
        sVar25 = 0;
        do {
          fVar65 = *(float *)(uVar22 + sVar25 * 4);
          fVar69 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar70 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar73 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          fVar88 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar89 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar43 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar45 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar28 = ~*(uint *)This.ptr & *puVar28 |
                     (uint)(((fVar2 * fVar76 + fVar123 * fVar36 + fVar91 * fVar78 + fVar73 * fVar38)
                             * fVar112 * fVar112 * fVar112 +
                            (fVar87 * fVar76 + fVar77 * fVar36 + fVar45 * fVar78 + fVar70 * fVar38)
                            * fVar112 * fVar112 * 3.0 * fVar50 +
                            (fVar83 * fVar76 + fVar49 * fVar36 + fVar43 * fVar78 + fVar69 * fVar38)
                            * fVar112 * 3.0 * fVar50 * fVar50 +
                            (fVar47 * fVar76 + fVar89 * fVar36 + fVar88 * fVar78 + fVar65 * fVar38)
                            * fVar50 * fVar50 * fVar50) * dscale) & *(uint *)This.ptr;
          puVar28[1] = ~uVar11 & puVar28[1] |
                       (uint)(((fVar2 * fVar82 +
                               fVar123 * fVar39 + fVar91 * fVar79 + fVar73 * fVar41) *
                               fVar118 * fVar118 * fVar118 +
                              (fVar87 * fVar82 + fVar77 * fVar39 + fVar45 * fVar79 + fVar70 * fVar41
                              ) * fVar118 * fVar118 * 3.0 * fVar56 +
                              (fVar83 * fVar82 + fVar49 * fVar39 + fVar43 * fVar79 + fVar69 * fVar41
                              ) * fVar118 * 3.0 * fVar56 * fVar56 +
                              (fVar47 * fVar82 + fVar89 * fVar39 + fVar88 * fVar79 + fVar65 * fVar41
                              ) * fVar56 * fVar56 * fVar56) * dscale) & uVar11;
          puVar28[2] = ~uVar14 & puVar28[2] |
                       (uint)(((fVar2 * fVar86 +
                               fVar123 * fVar42 + fVar91 * fVar84 + fVar73 * fVar44) *
                               fVar120 * fVar120 * fVar120 +
                              (fVar87 * fVar86 + fVar77 * fVar42 + fVar45 * fVar84 + fVar70 * fVar44
                              ) * fVar120 * fVar120 * 3.0 * fVar58 +
                              (fVar83 * fVar86 + fVar49 * fVar42 + fVar43 * fVar84 + fVar69 * fVar44
                              ) * fVar120 * 3.0 * fVar58 * fVar58 +
                              (fVar47 * fVar86 + fVar89 * fVar42 + fVar88 * fVar84 + fVar65 * fVar44
                              ) * fVar58 * fVar58 * fVar58) * dscale) & uVar14;
          puVar28[3] = ~uVar15 & puVar28[3] |
                       (uint)(((fVar2 * fVar90 +
                               fVar123 * fVar46 + fVar91 * fVar85 + fVar73 * fVar48) *
                               fVar124 * fVar124 * fVar124 +
                              (fVar87 * fVar90 + fVar77 * fVar46 + fVar45 * fVar85 + fVar70 * fVar48
                              ) * fVar124 * fVar124 * 3.0 * fVar60 +
                              (fVar83 * fVar90 + fVar49 * fVar46 + fVar43 * fVar85 + fVar69 * fVar48
                              ) * fVar124 * 3.0 * fVar60 * fVar60 +
                              (fVar47 * fVar90 + fVar89 * fVar46 + fVar88 * fVar85 + fVar65 * fVar48
                              ) * fVar60 * fVar60 * fVar60) * dscale) & uVar15;
          sVar25 = sVar25 + 1;
          puVar28 = puVar28 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
    }
    if (puVar27 != (uint *)0x0) {
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar42 = 1.0 - fVar112;
        fVar44 = 1.0 - fVar118;
        fVar46 = 1.0 - fVar120;
        fVar48 = 1.0 - fVar124;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = 1.0 - fVar76;
        fVar38 = 1.0 - fVar82;
        fVar39 = 1.0 - fVar86;
        fVar41 = 1.0 - fVar90;
        fVar50 = fVar76 * fVar76 * fVar76;
        fVar56 = fVar82 * fVar82 * fVar82;
        fVar58 = fVar86 * fVar86 * fVar86;
        fVar60 = fVar90 * fVar90 * fVar90;
        fVar78 = fVar76 * fVar76 * 3.0 * fVar36;
        fVar79 = fVar82 * fVar82 * 3.0 * fVar38;
        fVar84 = fVar86 * fVar86 * 3.0 * fVar39;
        fVar85 = fVar90 * fVar90 * 3.0 * fVar41;
        fVar65 = fVar36 * fVar36 * fVar36;
        fVar69 = fVar38 * fVar38 * fVar38;
        fVar70 = fVar39 * fVar39 * fVar39;
        fVar73 = fVar41 * fVar41 * fVar41;
        fVar76 = fVar76 * 3.0 * fVar36 * fVar36;
        fVar82 = fVar82 * 3.0 * fVar38 * fVar38;
        fVar86 = fVar86 * 3.0 * fVar39 * fVar39;
        fVar90 = fVar90 * 3.0 * fVar41 * fVar41;
        fVar36 = dscale * dscale;
        sVar25 = 0;
        do {
          fVar38 = *(float *)(uVar22 + sVar25 * 4);
          fVar39 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar41 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar88 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          fVar89 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar43 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar45 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar27 = ~*(uint *)This.ptr & *puVar27 |
                     (uint)(((fVar3 * fVar50 + fVar2 * fVar78 + fVar123 * fVar76 + fVar88 * fVar65)
                             * fVar112 * 6.0 +
                            (fVar91 * fVar50 + fVar83 * fVar78 + fVar47 * fVar76 + fVar41 * fVar65)
                            * (fVar42 - (fVar112 + fVar112)) * 6.0 +
                            (fVar87 * fVar50 + fVar77 * fVar78 + fVar45 * fVar76 + fVar39 * fVar65)
                            * (fVar112 - (fVar42 + fVar42)) * 6.0 +
                            (fVar49 * fVar50 + fVar43 * fVar78 + fVar89 * fVar76 + fVar38 * fVar65)
                            * fVar42 * 6.0) * fVar36) & *(uint *)This.ptr;
          puVar27[1] = ~uVar11 & puVar27[1] |
                       (uint)(((fVar3 * fVar56 + fVar2 * fVar79 + fVar123 * fVar82 + fVar88 * fVar69
                               ) * fVar118 * 6.0 +
                              (fVar91 * fVar56 + fVar83 * fVar79 + fVar47 * fVar82 + fVar41 * fVar69
                              ) * (fVar44 - (fVar118 + fVar118)) * 6.0 +
                              (fVar87 * fVar56 + fVar77 * fVar79 + fVar45 * fVar82 + fVar39 * fVar69
                              ) * (fVar118 - (fVar44 + fVar44)) * 6.0 +
                              (fVar49 * fVar56 + fVar43 * fVar79 + fVar89 * fVar82 + fVar38 * fVar69
                              ) * fVar44 * 6.0) * fVar36) & uVar11;
          puVar27[2] = ~uVar14 & puVar27[2] |
                       (uint)(((fVar3 * fVar58 + fVar2 * fVar84 + fVar123 * fVar86 + fVar88 * fVar70
                               ) * fVar120 * 6.0 +
                              (fVar91 * fVar58 + fVar83 * fVar84 + fVar47 * fVar86 + fVar41 * fVar70
                              ) * (fVar46 - (fVar120 + fVar120)) * 6.0 +
                              (fVar87 * fVar58 + fVar77 * fVar84 + fVar45 * fVar86 + fVar39 * fVar70
                              ) * (fVar120 - (fVar46 + fVar46)) * 6.0 +
                              (fVar49 * fVar58 + fVar43 * fVar84 + fVar89 * fVar86 + fVar38 * fVar70
                              ) * fVar46 * 6.0) * fVar36) & uVar14;
          puVar27[3] = ~uVar15 & puVar27[3] |
                       (uint)(((fVar3 * fVar60 + fVar2 * fVar85 + fVar123 * fVar90 + fVar88 * fVar73
                               ) * fVar124 * 6.0 +
                              (fVar91 * fVar60 + fVar83 * fVar85 + fVar47 * fVar90 + fVar41 * fVar73
                              ) * (fVar48 - (fVar124 + fVar124)) * 6.0 +
                              (fVar87 * fVar60 + fVar77 * fVar85 + fVar45 * fVar90 + fVar39 * fVar73
                              ) * (fVar124 - (fVar48 + fVar48)) * 6.0 +
                              (fVar49 * fVar60 + fVar43 * fVar85 + fVar89 * fVar90 + fVar38 * fVar73
                              ) * fVar48 * 6.0) * fVar36) & uVar15;
          sVar25 = sVar25 + 1;
          puVar27 = puVar27 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar36 = 1.0 - fVar112;
        fVar38 = 1.0 - fVar118;
        fVar39 = 1.0 - fVar120;
        fVar41 = 1.0 - fVar124;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar42 = 1.0 - fVar76;
        fVar46 = 1.0 - fVar82;
        fVar50 = 1.0 - fVar86;
        fVar58 = 1.0 - fVar90;
        fVar44 = fVar42 * 6.0;
        fVar48 = fVar46 * 6.0;
        fVar56 = fVar50 * 6.0;
        fVar60 = fVar58 * 6.0;
        fVar65 = (fVar76 - (fVar42 + fVar42)) * 6.0;
        fVar69 = (fVar82 - (fVar46 + fVar46)) * 6.0;
        fVar70 = (fVar86 - (fVar50 + fVar50)) * 6.0;
        fVar73 = (fVar90 - (fVar58 + fVar58)) * 6.0;
        fVar78 = (fVar42 - (fVar76 + fVar76)) * 6.0;
        fVar46 = (fVar46 - (fVar82 + fVar82)) * 6.0;
        fVar50 = (fVar50 - (fVar86 + fVar86)) * 6.0;
        fVar58 = (fVar58 - (fVar90 + fVar90)) * 6.0;
        fVar76 = fVar76 * 6.0;
        fVar82 = fVar82 * 6.0;
        fVar86 = fVar86 * 6.0;
        fVar90 = fVar90 * 6.0;
        fVar42 = dscale * dscale;
        sVar25 = 0;
        do {
          fVar79 = *(float *)(uVar22 + sVar25 * 4);
          fVar84 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar85 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar88 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          fVar89 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar43 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar45 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar35 = ~*(uint *)This.ptr & *puVar35 |
                     (uint)(((fVar3 * fVar76 + fVar2 * fVar78 + fVar123 * fVar65 + fVar88 * fVar44)
                             * fVar112 * fVar112 * fVar112 +
                            (fVar91 * fVar76 + fVar83 * fVar78 + fVar47 * fVar65 + fVar85 * fVar44)
                            * fVar112 * fVar112 * 3.0 * fVar36 +
                            (fVar87 * fVar76 + fVar77 * fVar78 + fVar45 * fVar65 + fVar84 * fVar44)
                            * fVar112 * 3.0 * fVar36 * fVar36 +
                            (fVar49 * fVar76 + fVar43 * fVar78 + fVar89 * fVar65 + fVar79 * fVar44)
                            * fVar36 * fVar36 * fVar36) * fVar42) & *(uint *)This.ptr;
          puVar35[1] = ~uVar11 & puVar35[1] |
                       (uint)(((fVar3 * fVar82 + fVar2 * fVar46 + fVar123 * fVar69 + fVar88 * fVar48
                               ) * fVar118 * fVar118 * fVar118 +
                              (fVar91 * fVar82 + fVar83 * fVar46 + fVar47 * fVar69 + fVar85 * fVar48
                              ) * fVar118 * fVar118 * 3.0 * fVar38 +
                              (fVar87 * fVar82 + fVar77 * fVar46 + fVar45 * fVar69 + fVar84 * fVar48
                              ) * fVar118 * 3.0 * fVar38 * fVar38 +
                              (fVar49 * fVar82 + fVar43 * fVar46 + fVar89 * fVar69 + fVar79 * fVar48
                              ) * fVar38 * fVar38 * fVar38) * fVar42) & uVar11;
          puVar35[2] = ~uVar14 & puVar35[2] |
                       (uint)(((fVar3 * fVar86 + fVar2 * fVar50 + fVar123 * fVar70 + fVar88 * fVar56
                               ) * fVar120 * fVar120 * fVar120 +
                              (fVar91 * fVar86 + fVar83 * fVar50 + fVar47 * fVar70 + fVar85 * fVar56
                              ) * fVar120 * fVar120 * 3.0 * fVar39 +
                              (fVar87 * fVar86 + fVar77 * fVar50 + fVar45 * fVar70 + fVar84 * fVar56
                              ) * fVar120 * 3.0 * fVar39 * fVar39 +
                              (fVar49 * fVar86 + fVar43 * fVar50 + fVar89 * fVar70 + fVar79 * fVar56
                              ) * fVar39 * fVar39 * fVar39) * fVar42) & uVar14;
          puVar35[3] = ~uVar15 & puVar35[3] |
                       (uint)(((fVar3 * fVar90 + fVar2 * fVar58 + fVar123 * fVar73 + fVar88 * fVar60
                               ) * fVar124 * fVar124 * fVar124 +
                              (fVar91 * fVar90 + fVar83 * fVar58 + fVar47 * fVar73 + fVar85 * fVar60
                              ) * fVar124 * fVar124 * 3.0 * fVar41 +
                              (fVar87 * fVar90 + fVar77 * fVar58 + fVar45 * fVar73 + fVar84 * fVar60
                              ) * fVar124 * 3.0 * fVar41 * fVar41 +
                              (fVar49 * fVar90 + fVar43 * fVar58 + fVar89 * fVar73 + fVar79 * fVar60
                              ) * fVar41 * fVar41 * fVar41) * fVar42) & uVar15;
          sVar25 = sVar25 + 1;
          puVar35 = puVar35 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar50 = 1.0 - fVar112;
        fVar56 = 1.0 - fVar118;
        fVar58 = 1.0 - fVar120;
        fVar60 = 1.0 - fVar124;
        fVar65 = fVar112 * fVar50 + fVar112 * fVar50;
        fVar69 = fVar118 * fVar56 + fVar118 * fVar56;
        fVar70 = fVar120 * fVar58 + fVar120 * fVar58;
        fVar73 = fVar124 * fVar60 + fVar124 * fVar60;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = 1.0 - fVar76;
        fVar39 = 1.0 - fVar82;
        fVar42 = 1.0 - fVar86;
        fVar46 = 1.0 - fVar90;
        fVar78 = fVar76 * fVar36 + fVar76 * fVar36;
        fVar79 = fVar82 * fVar39 + fVar82 * fVar39;
        fVar84 = fVar86 * fVar42 + fVar86 * fVar42;
        fVar85 = fVar90 * fVar46 + fVar90 * fVar46;
        fVar38 = fVar36 * fVar36 * -3.0;
        fVar41 = fVar39 * fVar39 * -3.0;
        fVar44 = fVar42 * fVar42 * -3.0;
        fVar48 = fVar46 * fVar46 * -3.0;
        fVar88 = (fVar36 * fVar36 - fVar78) * 3.0;
        fVar89 = (fVar39 * fVar39 - fVar79) * 3.0;
        fVar43 = (fVar42 * fVar42 - fVar84) * 3.0;
        fVar45 = (fVar46 * fVar46 - fVar85) * 3.0;
        fVar36 = (fVar78 - fVar76 * fVar76) * 3.0;
        fVar39 = (fVar79 - fVar82 * fVar82) * 3.0;
        fVar42 = (fVar84 - fVar86 * fVar86) * 3.0;
        fVar46 = (fVar85 - fVar90 * fVar90) * 3.0;
        fVar76 = fVar76 * fVar76 * 3.0;
        fVar82 = fVar82 * fVar82 * 3.0;
        fVar86 = fVar86 * fVar86 * 3.0;
        fVar90 = fVar90 * fVar90 * 3.0;
        fVar78 = dscale * dscale;
        sVar25 = 0;
        do {
          fVar79 = *(float *)(uVar22 + sVar25 * 4);
          fVar84 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar85 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar5 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar6 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar7 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar19 = ~*(uint *)This.ptr & *puVar19 |
                     (uint)(((fVar7 * fVar76 + fVar6 * fVar36 + fVar5 * fVar88 + fVar47 * fVar38) *
                             fVar112 * fVar112 * 3.0 +
                            (fVar4 * fVar76 + fVar2 * fVar36 + fVar87 * fVar88 + fVar85 * fVar38) *
                            (fVar65 - fVar112 * fVar112) * 3.0 +
                            ((fVar3 * fVar76 + fVar123 * fVar36 + fVar83 * fVar88 + fVar84 * fVar38)
                             * (fVar50 * fVar50 - fVar65) * 3.0 -
                            (fVar91 * fVar76 + fVar77 * fVar36 + fVar49 * fVar88 + fVar79 * fVar38)
                            * fVar50 * fVar50 * 3.0)) * fVar78) & *(uint *)This.ptr;
          puVar19[1] = ~uVar11 & puVar19[1] |
                       (uint)(((fVar7 * fVar82 + fVar6 * fVar39 + fVar5 * fVar89 + fVar47 * fVar41)
                               * fVar118 * fVar118 * 3.0 +
                              (fVar4 * fVar82 + fVar2 * fVar39 + fVar87 * fVar89 + fVar85 * fVar41)
                              * (fVar69 - fVar118 * fVar118) * 3.0 +
                              ((fVar3 * fVar82 +
                               fVar123 * fVar39 + fVar83 * fVar89 + fVar84 * fVar41) *
                               (fVar56 * fVar56 - fVar69) * 3.0 -
                              (fVar91 * fVar82 + fVar77 * fVar39 + fVar49 * fVar89 + fVar79 * fVar41
                              ) * fVar56 * fVar56 * 3.0)) * fVar78) & uVar11;
          puVar19[2] = ~uVar14 & puVar19[2] |
                       (uint)(((fVar7 * fVar86 + fVar6 * fVar42 + fVar5 * fVar43 + fVar47 * fVar44)
                               * fVar120 * fVar120 * 3.0 +
                              (fVar4 * fVar86 + fVar2 * fVar42 + fVar87 * fVar43 + fVar85 * fVar44)
                              * (fVar70 - fVar120 * fVar120) * 3.0 +
                              ((fVar3 * fVar86 +
                               fVar123 * fVar42 + fVar83 * fVar43 + fVar84 * fVar44) *
                               (fVar58 * fVar58 - fVar70) * 3.0 -
                              (fVar91 * fVar86 + fVar77 * fVar42 + fVar49 * fVar43 + fVar79 * fVar44
                              ) * fVar58 * fVar58 * 3.0)) * fVar78) & uVar14;
          puVar19[3] = ~uVar15 & puVar19[3] |
                       (uint)(((fVar7 * fVar90 + fVar6 * fVar46 + fVar5 * fVar45 + fVar47 * fVar48)
                               * fVar124 * fVar124 * 3.0 +
                              (fVar4 * fVar90 + fVar2 * fVar46 + fVar87 * fVar45 + fVar85 * fVar48)
                              * (fVar73 - fVar124 * fVar124) * 3.0 +
                              ((fVar3 * fVar90 +
                               fVar123 * fVar46 + fVar83 * fVar45 + fVar84 * fVar48) *
                               (fVar60 * fVar60 - fVar73) * 3.0 -
                              (fVar91 * fVar90 + fVar77 * fVar46 + fVar49 * fVar45 + fVar79 * fVar48
                              ) * fVar60 * fVar60 * 3.0)) * fVar78) & uVar15;
          sVar25 = sVar25 + 1;
          puVar19 = puVar19 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
    }
    goto LAB_00e3587e;
  case 4:
    uVar22 = (ulong)u & 0xfffffffffffffff0;
    puVar30 = *(uint **)&valid->field_0;
    puVar29 = *(uint **)((long)&valid->field_0 + 8);
    puVar28 = *(uint **)&valid[1].field_0;
    puVar27 = *(uint **)((long)&valid[1].field_0 + 8);
    puVar35 = *(uint **)&valid[2].field_0;
    puVar19 = *(uint **)((long)&valid[2].field_0 + 8);
    lVar20 = *(long *)&valid[3].field_0;
    RVar21.ptr = *(size_t *)((long)&valid[3].field_0 + 8);
    if ((puVar30 != (uint *)0x0) && (RVar21.ptr != 0)) {
      fVar112 = (v->field_0).v[0];
      fVar118 = (v->field_0).v[1];
      fVar120 = (v->field_0).v[2];
      fVar124 = (v->field_0).v[3];
      fVar36 = 1.0 - fVar112;
      fVar38 = 1.0 - fVar118;
      fVar39 = 1.0 - fVar120;
      fVar41 = 1.0 - fVar124;
      fVar76 = *(float *)depth;
      fVar82 = *(float *)(depth + 4);
      fVar86 = *(float *)(depth + 8);
      fVar90 = *(float *)(depth + 0xc);
      fVar42 = 1.0 - fVar76;
      fVar44 = 1.0 - fVar82;
      fVar46 = 1.0 - fVar86;
      fVar48 = 1.0 - fVar90;
      fVar65 = fVar76 * fVar76 * 3.0 * fVar42;
      fVar69 = fVar82 * fVar82 * 3.0 * fVar44;
      fVar70 = fVar86 * fVar86 * 3.0 * fVar46;
      fVar73 = fVar90 * fVar90 * 3.0 * fVar48;
      fVar50 = fVar42 * fVar42 * fVar42;
      fVar56 = fVar44 * fVar44 * fVar44;
      fVar58 = fVar46 * fVar46 * fVar46;
      fVar60 = fVar48 * fVar48 * fVar48;
      fVar42 = fVar76 * 3.0 * fVar42 * fVar42;
      fVar44 = fVar82 * 3.0 * fVar44 * fVar44;
      fVar46 = fVar86 * 3.0 * fVar46 * fVar46;
      fVar48 = fVar90 * 3.0 * fVar48 * fVar48;
      fVar76 = fVar76 * fVar76 * fVar76;
      fVar82 = fVar82 * fVar82 * fVar82;
      fVar86 = fVar86 * fVar86 * fVar86;
      fVar90 = fVar90 * fVar90 * fVar90;
      sVar25 = 0;
      do {
        fVar3 = (v->field_0).v[0];
        fVar4 = (v->field_0).v[1];
        fVar5 = (v->field_0).v[2];
        fVar6 = (v->field_0).v[3];
        fVar7 = *(float *)depth;
        fVar8 = *(float *)(depth + 4);
        fVar9 = *(float *)(depth + 8);
        fVar10 = *(float *)(depth + 0xc);
        fVar78 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
        fVar79 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
        fVar84 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
        fVar85 = *(float *)(uVar22 + 0x100 + sVar25 * 4);
        fVar88 = *(float *)(uVar22 + 0x110 + sVar25 * 4);
        fVar89 = *(float *)(uVar22 + 0x130 + sVar25 * 4);
        fVar77 = 1.0 - fVar3;
        fVar83 = 1.0 - fVar4;
        fVar87 = 1.0 - fVar5;
        fVar91 = 1.0 - fVar6;
        fVar43 = 1.0 - fVar7;
        fVar45 = 1.0 - fVar8;
        fVar47 = 1.0 - fVar9;
        fVar49 = 1.0 - fVar10;
        uVar136 = -(uint)((fVar3 != 0.0 && fVar3 != 1.0) && (fVar7 != 0.0 && fVar7 != 1.0));
        uVar140 = -(uint)((fVar4 != 0.0 && fVar4 != 1.0) && (fVar8 != 0.0 && fVar8 != 1.0));
        uVar141 = -(uint)((fVar5 != 0.0 && fVar5 != 1.0) && (fVar9 != 0.0 && fVar9 != 1.0));
        uVar142 = -(uint)((fVar6 != 0.0 && fVar6 != 1.0) && (fVar10 != 0.0 && fVar10 != 1.0));
        auVar144._0_4_ = fVar3 + fVar7;
        auVar144._4_4_ = fVar4 + fVar8;
        auVar144._8_4_ = fVar5 + fVar9;
        auVar144._12_4_ = fVar6 + fVar10;
        auVar99 = rcpps(in_XMM7,auVar144);
        fVar96 = auVar99._0_4_;
        fVar51 = auVar99._4_4_;
        fVar59 = auVar99._8_4_;
        fVar71 = auVar99._12_4_;
        auVar99._0_4_ = fVar88 * fVar77;
        auVar99._4_4_ = fVar88 * fVar83;
        auVar99._8_4_ = fVar88 * fVar87;
        auVar99._12_4_ = fVar88 * fVar91;
        auVar145._0_4_ = fVar77 + fVar7;
        auVar145._4_4_ = fVar83 + fVar8;
        auVar145._8_4_ = fVar87 + fVar9;
        auVar145._12_4_ = fVar91 + fVar10;
        auVar63 = rcpps(auVar99,auVar145);
        fVar62 = auVar63._0_4_;
        fVar64 = auVar63._4_4_;
        fVar92 = auVar63._8_4_;
        fVar95 = auVar63._12_4_;
        auVar100._0_4_ = fVar77 * fVar84;
        auVar100._4_4_ = fVar83 * fVar84;
        auVar100._8_4_ = fVar87 * fVar84;
        auVar100._12_4_ = fVar91 * fVar84;
        in_XMM9._0_4_ = fVar89 * fVar43 + auVar100._0_4_;
        in_XMM9._4_4_ = fVar89 * fVar45 + auVar100._4_4_;
        in_XMM9._8_4_ = fVar89 * fVar47 + auVar100._8_4_;
        in_XMM9._12_4_ = fVar89 * fVar49 + auVar100._12_4_;
        auVar63._0_4_ = fVar77 + fVar43;
        auVar63._4_4_ = fVar83 + fVar45;
        auVar63._8_4_ = fVar87 + fVar47;
        auVar63._12_4_ = fVar91 + fVar49;
        auVar100 = rcpps(auVar100,auVar63);
        fVar97 = auVar100._0_4_;
        fVar57 = auVar100._4_4_;
        fVar61 = auVar100._8_4_;
        fVar74 = auVar100._12_4_;
        fVar88 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
        fVar89 = *(float *)(uVar22 + 0x120 + sVar25 * 4);
        auVar128._0_4_ = fVar3 + fVar43;
        auVar128._4_4_ = fVar4 + fVar45;
        auVar128._8_4_ = fVar5 + fVar47;
        auVar128._12_4_ = fVar6 + fVar49;
        in_XMM7 = rcpps(auVar100,auVar128);
        fVar77 = in_XMM7._0_4_;
        fVar83 = in_XMM7._4_4_;
        fVar87 = in_XMM7._8_4_;
        fVar91 = in_XMM7._12_4_;
        in_XMM8._0_4_ =
             (uint)(((1.0 - auVar128._0_4_ * fVar77) * fVar77 + fVar77) *
                   (fVar43 * fVar88 + fVar89 * fVar3)) & uVar136;
        in_XMM8._4_4_ =
             (uint)(((1.0 - auVar128._4_4_ * fVar83) * fVar83 + fVar83) *
                   (fVar45 * fVar88 + fVar89 * fVar4)) & uVar140;
        in_XMM8._8_4_ =
             (uint)(((1.0 - auVar128._8_4_ * fVar87) * fVar87 + fVar87) *
                   (fVar47 * fVar88 + fVar89 * fVar5)) & uVar141;
        in_XMM8._12_4_ =
             (uint)(((1.0 - auVar128._12_4_ * fVar91) * fVar91 + fVar91) *
                   (fVar49 * fVar88 + fVar89 * fVar6)) & uVar142;
        auVar137._0_4_ = ~uVar136 & (uint)fVar88;
        auVar137._4_4_ = ~uVar140 & (uint)fVar88;
        auVar137._8_4_ = ~uVar141 & (uint)fVar88;
        auVar137._12_4_ = ~uVar142 & (uint)fVar88;
        auVar137 = auVar137 | in_XMM8;
        fVar88 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
        fVar89 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
        fVar43 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
        fVar45 = *(float *)(uVar22 + sVar25 * 4);
        fVar47 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
        fVar49 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
        fVar77 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
        fVar83 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
        fVar87 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
        fVar91 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
        fVar123 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
        fVar2 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
        uVar11 = *(uint *)(This.ptr + 4);
        uVar14 = *(uint *)(This.ptr + 8);
        uVar15 = *(uint *)(This.ptr + 0xc);
        *puVar30 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)((fVar91 * fVar50 + fVar87 * fVar42 + fVar77 * fVar65 + fVar83 * fVar76) *
                          fVar112 * fVar112 * fVar112 +
                          (fVar123 * fVar50 +
                          (float)(~uVar136 & (uint)fVar79 |
                                 (uint)(((1.0 - auVar145._0_4_ * fVar62) * fVar62 + fVar62) *
                                       (fVar7 * fVar79 + auVar99._0_4_)) & uVar136) * fVar42 +
                          (float)(~uVar136 & (uint)fVar84 |
                                 (uint)(((1.0 - auVar63._0_4_ * fVar97) * fVar97 + fVar97) *
                                       in_XMM9._0_4_) & uVar136) * fVar65 + fVar49 * fVar76) *
                          fVar112 * fVar112 * 3.0 * fVar36 +
                          (fVar2 * fVar50 +
                          (float)(~uVar136 & (uint)fVar78 |
                                 (uint)(((1.0 - auVar144._0_4_ * fVar96) * fVar96 + fVar96) *
                                       (fVar85 * fVar7 + fVar3 * fVar78)) & uVar136) * fVar42 +
                          auVar137._0_4_ * fVar65 + fVar47 * fVar76) *
                          fVar112 * 3.0 * fVar36 * fVar36 +
                         (fVar45 * fVar50 + fVar43 * fVar42 + fVar88 * fVar65 + fVar89 * fVar76) *
                         fVar36 * fVar36 * fVar36) & *(uint *)This.ptr;
        puVar30[1] = ~uVar11 & puVar30[1] |
                     (uint)((fVar91 * fVar56 + fVar87 * fVar44 + fVar77 * fVar69 + fVar83 * fVar82)
                            * fVar118 * fVar118 * fVar118 +
                            (fVar123 * fVar56 +
                            (float)(~uVar140 & (uint)fVar79 |
                                   (uint)(((1.0 - auVar145._4_4_ * fVar64) * fVar64 + fVar64) *
                                         (fVar8 * fVar79 + auVar99._4_4_)) & uVar140) * fVar44 +
                            (float)(~uVar140 & (uint)fVar84 |
                                   (uint)(((1.0 - auVar63._4_4_ * fVar57) * fVar57 + fVar57) *
                                         in_XMM9._4_4_) & uVar140) * fVar69 + fVar49 * fVar82) *
                            fVar118 * fVar118 * 3.0 * fVar38 +
                            (fVar2 * fVar56 +
                            (float)(~uVar140 & (uint)fVar78 |
                                   (uint)(((1.0 - auVar144._4_4_ * fVar51) * fVar51 + fVar51) *
                                         (fVar85 * fVar8 + fVar4 * fVar78)) & uVar140) * fVar44 +
                            auVar137._4_4_ * fVar69 + fVar47 * fVar82) *
                            fVar118 * 3.0 * fVar38 * fVar38 +
                           (fVar45 * fVar56 + fVar43 * fVar44 + fVar88 * fVar69 + fVar89 * fVar82) *
                           fVar38 * fVar38 * fVar38) & uVar11;
        puVar30[2] = ~uVar14 & puVar30[2] |
                     (uint)((fVar91 * fVar58 + fVar87 * fVar46 + fVar77 * fVar70 + fVar83 * fVar86)
                            * fVar120 * fVar120 * fVar120 +
                            (fVar123 * fVar58 +
                            (float)(~uVar141 & (uint)fVar79 |
                                   (uint)(((1.0 - auVar145._8_4_ * fVar92) * fVar92 + fVar92) *
                                         (fVar9 * fVar79 + auVar99._8_4_)) & uVar141) * fVar46 +
                            (float)(~uVar141 & (uint)fVar84 |
                                   (uint)(((1.0 - auVar63._8_4_ * fVar61) * fVar61 + fVar61) *
                                         in_XMM9._8_4_) & uVar141) * fVar70 + fVar49 * fVar86) *
                            fVar120 * fVar120 * 3.0 * fVar39 +
                            (fVar2 * fVar58 +
                            (float)(~uVar141 & (uint)fVar78 |
                                   (uint)(((1.0 - auVar144._8_4_ * fVar59) * fVar59 + fVar59) *
                                         (fVar85 * fVar9 + fVar5 * fVar78)) & uVar141) * fVar46 +
                            auVar137._8_4_ * fVar70 + fVar47 * fVar86) *
                            fVar120 * 3.0 * fVar39 * fVar39 +
                           (fVar45 * fVar58 + fVar43 * fVar46 + fVar88 * fVar70 + fVar89 * fVar86) *
                           fVar39 * fVar39 * fVar39) & uVar14;
        puVar30[3] = ~uVar15 & puVar30[3] |
                     (uint)((fVar91 * fVar60 + fVar87 * fVar48 + fVar77 * fVar73 + fVar83 * fVar90)
                            * fVar124 * fVar124 * fVar124 +
                            (fVar123 * fVar60 +
                            (float)(~uVar142 & (uint)fVar79 |
                                   (uint)(((1.0 - auVar145._12_4_ * fVar95) * fVar95 + fVar95) *
                                         (fVar10 * fVar79 + auVar99._12_4_)) & uVar142) * fVar48 +
                            (float)(~uVar142 & (uint)fVar84 |
                                   (uint)(((1.0 - auVar63._12_4_ * fVar74) * fVar74 + fVar74) *
                                         in_XMM9._12_4_) & uVar142) * fVar73 + fVar49 * fVar90) *
                            fVar124 * fVar124 * 3.0 * fVar41 +
                            (fVar2 * fVar60 +
                            (float)(~uVar142 & (uint)fVar78 |
                                   (uint)(((1.0 - auVar144._12_4_ * fVar71) * fVar71 + fVar71) *
                                         (fVar85 * fVar10 + fVar6 * fVar78)) & uVar142) * fVar48 +
                            auVar137._12_4_ * fVar73 + fVar47 * fVar90) *
                            fVar124 * 3.0 * fVar41 * fVar41 +
                           (fVar45 * fVar60 + fVar43 * fVar48 + fVar88 * fVar73 + fVar89 * fVar90) *
                           fVar41 * fVar41 * fVar41) & uVar15;
        sVar25 = sVar25 + 1;
        puVar30 = puVar30 + lVar20;
      } while (RVar21.ptr != sVar25);
    }
    if (puVar29 != (uint *)0x0) {
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar65 = 1.0 - fVar112;
        fVar69 = 1.0 - fVar118;
        fVar70 = 1.0 - fVar120;
        fVar73 = 1.0 - fVar124;
        fVar78 = fVar112 * fVar65 + fVar112 * fVar65;
        fVar84 = fVar118 * fVar69 + fVar118 * fVar69;
        fVar88 = fVar120 * fVar70 + fVar120 * fVar70;
        fVar43 = fVar124 * fVar73 + fVar124 * fVar73;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = 1.0 - fVar76;
        fVar38 = 1.0 - fVar82;
        fVar39 = 1.0 - fVar86;
        fVar41 = 1.0 - fVar90;
        fVar50 = fVar76 * fVar76 * fVar76;
        fVar56 = fVar82 * fVar82 * fVar82;
        fVar58 = fVar86 * fVar86 * fVar86;
        fVar60 = fVar90 * fVar90 * fVar90;
        fVar79 = fVar76 * fVar76 * 3.0 * fVar36;
        fVar85 = fVar82 * fVar82 * 3.0 * fVar38;
        fVar89 = fVar86 * fVar86 * 3.0 * fVar39;
        fVar45 = fVar90 * fVar90 * 3.0 * fVar41;
        fVar42 = fVar36 * fVar36 * fVar36;
        fVar44 = fVar38 * fVar38 * fVar38;
        fVar46 = fVar39 * fVar39 * fVar39;
        fVar48 = fVar41 * fVar41 * fVar41;
        fVar76 = fVar76 * 3.0 * fVar36 * fVar36;
        fVar82 = fVar82 * 3.0 * fVar38 * fVar38;
        fVar86 = fVar86 * 3.0 * fVar39 * fVar39;
        fVar90 = fVar90 * 3.0 * fVar41 * fVar41;
        sVar25 = 0;
        do {
          fVar9 = (v->field_0).v[0];
          fVar10 = (v->field_0).v[1];
          fVar62 = (v->field_0).v[2];
          fVar64 = (v->field_0).v[3];
          fVar92 = *(float *)depth;
          fVar95 = *(float *)(depth + 4);
          fVar96 = *(float *)(depth + 8);
          fVar97 = *(float *)(depth + 0xc);
          fVar36 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar38 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar39 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar41 = *(float *)(uVar22 + 0x100 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x110 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x130 + sVar25 * 4);
          fVar111 = 1.0 - fVar9;
          fVar117 = 1.0 - fVar10;
          fVar119 = 1.0 - fVar62;
          fVar122 = 1.0 - fVar64;
          fVar51 = 1.0 - fVar92;
          fVar57 = 1.0 - fVar95;
          fVar59 = 1.0 - fVar96;
          fVar61 = 1.0 - fVar97;
          uVar136 = -(uint)((fVar9 != 0.0 && fVar9 != 1.0) && (fVar92 != 0.0 && fVar92 != 1.0));
          uVar140 = -(uint)((fVar10 != 0.0 && fVar10 != 1.0) && (fVar95 != 0.0 && fVar95 != 1.0));
          uVar141 = -(uint)((fVar62 != 0.0 && fVar62 != 1.0) && (fVar96 != 0.0 && fVar96 != 1.0));
          uVar142 = -(uint)((fVar64 != 0.0 && fVar64 != 1.0) && (fVar97 != 0.0 && fVar97 != 1.0));
          auVar93._0_4_ = fVar9 + fVar92;
          auVar93._4_4_ = fVar10 + fVar95;
          auVar93._8_4_ = fVar62 + fVar96;
          auVar93._12_4_ = fVar64 + fVar97;
          auVar99 = rcpps(in_XMM7,auVar93);
          fVar125 = auVar99._0_4_;
          auVar94._0_4_ = auVar93._0_4_ * fVar125;
          fVar72 = auVar99._4_4_;
          auVar94._4_4_ = auVar93._4_4_ * fVar72;
          fVar98 = auVar99._8_4_;
          auVar94._8_4_ = auVar93._8_4_ * fVar98;
          fVar75 = auVar99._12_4_;
          auVar94._12_4_ = auVar93._12_4_ * fVar75;
          auVar138._0_4_ = fVar111 + fVar92;
          auVar138._4_4_ = fVar117 + fVar95;
          auVar138._8_4_ = fVar119 + fVar96;
          auVar138._12_4_ = fVar122 + fVar97;
          auVar99 = rcpps(auVar94,auVar138);
          fVar71 = auVar99._0_4_;
          auVar139._0_4_ = auVar138._0_4_ * fVar71;
          fVar74 = auVar99._4_4_;
          auVar139._4_4_ = auVar138._4_4_ * fVar74;
          fVar121 = auVar99._8_4_;
          auVar139._8_4_ = auVar138._8_4_ * fVar121;
          fVar66 = auVar99._12_4_;
          auVar139._12_4_ = auVar138._12_4_ * fVar66;
          auVar113._0_4_ = fVar111 + fVar51;
          auVar113._4_4_ = fVar117 + fVar57;
          auVar113._8_4_ = fVar119 + fVar59;
          auVar113._12_4_ = fVar122 + fVar61;
          auVar99 = rcpps(auVar139,auVar113);
          fVar109 = auVar99._0_4_;
          fVar108 = auVar99._4_4_;
          fVar110 = auVar99._8_4_;
          fVar132 = auVar99._12_4_;
          fVar77 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0x120 + sVar25 * 4);
          auVar114._0_4_ = fVar83 * fVar9;
          auVar114._4_4_ = fVar83 * fVar10;
          auVar114._8_4_ = fVar83 * fVar62;
          auVar114._12_4_ = fVar83 * fVar64;
          auVar154._0_4_ = fVar9 + fVar51;
          auVar154._4_4_ = fVar10 + fVar57;
          auVar154._8_4_ = fVar62 + fVar59;
          auVar154._12_4_ = fVar64 + fVar61;
          auVar99 = rcpps(auVar114,auVar154);
          fVar83 = auVar99._0_4_;
          fVar87 = auVar99._4_4_;
          fVar91 = auVar99._8_4_;
          fVar123 = auVar99._12_4_;
          in_XMM9._0_4_ =
               (float)((uint)(((1.0 - auVar154._0_4_ * fVar83) * fVar83 + fVar83) *
                             (fVar51 * fVar77 + auVar114._0_4_)) & uVar136);
          in_XMM9._4_4_ =
               (float)((uint)(((1.0 - auVar154._4_4_ * fVar87) * fVar87 + fVar87) *
                             (fVar57 * fVar77 + auVar114._4_4_)) & uVar140);
          in_XMM9._8_4_ =
               (float)((uint)(((1.0 - auVar154._8_4_ * fVar91) * fVar91 + fVar91) *
                             (fVar59 * fVar77 + auVar114._8_4_)) & uVar141);
          in_XMM9._12_4_ =
               (float)((uint)(((1.0 - auVar154._12_4_ * fVar123) * fVar123 + fVar123) *
                             (fVar61 * fVar77 + auVar114._12_4_)) & uVar142);
          auVar151._0_4_ = ~uVar136 & (uint)fVar77;
          auVar151._4_4_ = ~uVar140 & (uint)fVar77;
          auVar151._8_4_ = ~uVar141 & (uint)fVar77;
          auVar151._12_4_ = ~uVar142 & (uint)fVar77;
          fVar77 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          auVar151 = auVar151 | in_XMM9;
          fVar83 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          in_XMM7._4_4_ = fVar82;
          in_XMM7._0_4_ = fVar76;
          in_XMM7._8_4_ = fVar86;
          in_XMM7._12_4_ = fVar90;
          fVar91 = *(float *)(uVar22 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar5 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar6 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          fVar7 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar8 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar29 = ~*(uint *)This.ptr & *puVar29 |
                     (uint)((((fVar8 * fVar42 + fVar7 * fVar76 + fVar5 * fVar79 + fVar6 * fVar50) *
                              fVar112 * fVar112 * 3.0 +
                              (fVar4 * fVar42 +
                              (float)(~uVar136 & (uint)fVar38 |
                                     (uint)(((1.0 - auVar139._0_4_) * fVar71 + fVar71) *
                                           (fVar92 * fVar38 + fVar47 * fVar111)) & uVar136) * fVar76
                              + (float)(~uVar136 & (uint)fVar39 |
                                       (uint)(((1.0 - auVar113._0_4_ * fVar109) * fVar109 + fVar109)
                                             * (fVar49 * fVar51 + fVar111 * fVar39)) & uVar136) *
                                fVar79 + fVar2 * fVar50) * (fVar78 - fVar112 * fVar112) * 3.0 +
                             (fVar3 * fVar42 +
                             (float)(~uVar136 & (uint)fVar36 |
                                    (uint)(((1.0 - auVar94._0_4_) * fVar125 + fVar125) *
                                          (fVar41 * fVar92 + fVar9 * fVar36)) & uVar136) * fVar76 +
                             auVar151._0_4_ * fVar79 + fVar123 * fVar50) *
                             (fVar65 * fVar65 - fVar78) * 3.0) -
                            (fVar91 * fVar42 + fVar87 * fVar76 + fVar77 * fVar79 + fVar83 * fVar50)
                            * fVar65 * fVar65 * 3.0) * dscale) & *(uint *)This.ptr;
          puVar29[1] = ~uVar11 & puVar29[1] |
                       (uint)((((fVar8 * fVar44 + fVar7 * fVar82 + fVar5 * fVar85 + fVar6 * fVar56)
                                * fVar118 * fVar118 * 3.0 +
                                (fVar4 * fVar44 +
                                (float)(~uVar140 & (uint)fVar38 |
                                       (uint)(((1.0 - auVar139._4_4_) * fVar74 + fVar74) *
                                             (fVar95 * fVar38 + fVar47 * fVar117)) & uVar140) *
                                fVar82 + (float)(~uVar140 & (uint)fVar39 |
                                                (uint)(((1.0 - auVar113._4_4_ * fVar108) * fVar108 +
                                                       fVar108) *
                                                      (fVar49 * fVar57 + fVar117 * fVar39)) &
                                                uVar140) * fVar85 + fVar2 * fVar56) *
                                (fVar84 - fVar118 * fVar118) * 3.0 +
                               (fVar3 * fVar44 +
                               (float)(~uVar140 & (uint)fVar36 |
                                      (uint)(((1.0 - auVar94._4_4_) * fVar72 + fVar72) *
                                            (fVar41 * fVar95 + fVar10 * fVar36)) & uVar140) * fVar82
                               + auVar151._4_4_ * fVar85 + fVar123 * fVar56) *
                               (fVar69 * fVar69 - fVar84) * 3.0) -
                              (fVar91 * fVar44 + fVar87 * fVar82 + fVar77 * fVar85 + fVar83 * fVar56
                              ) * fVar69 * fVar69 * 3.0) * dscale) & uVar11;
          puVar29[2] = ~uVar14 & puVar29[2] |
                       (uint)((((fVar8 * fVar46 + fVar7 * fVar86 + fVar5 * fVar89 + fVar6 * fVar58)
                                * fVar120 * fVar120 * 3.0 +
                                (fVar4 * fVar46 +
                                (float)(~uVar141 & (uint)fVar38 |
                                       (uint)(((1.0 - auVar139._8_4_) * fVar121 + fVar121) *
                                             (fVar96 * fVar38 + fVar47 * fVar119)) & uVar141) *
                                fVar86 + (float)(~uVar141 & (uint)fVar39 |
                                                (uint)(((1.0 - auVar113._8_4_ * fVar110) * fVar110 +
                                                       fVar110) *
                                                      (fVar49 * fVar59 + fVar119 * fVar39)) &
                                                uVar141) * fVar89 + fVar2 * fVar58) *
                                (fVar88 - fVar120 * fVar120) * 3.0 +
                               (fVar3 * fVar46 +
                               (float)(~uVar141 & (uint)fVar36 |
                                      (uint)(((1.0 - auVar94._8_4_) * fVar98 + fVar98) *
                                            (fVar41 * fVar96 + fVar62 * fVar36)) & uVar141) * fVar86
                               + auVar151._8_4_ * fVar89 + fVar123 * fVar58) *
                               (fVar70 * fVar70 - fVar88) * 3.0) -
                              (fVar91 * fVar46 + fVar87 * fVar86 + fVar77 * fVar89 + fVar83 * fVar58
                              ) * fVar70 * fVar70 * 3.0) * dscale) & uVar14;
          puVar29[3] = ~uVar15 & puVar29[3] |
                       (uint)((((fVar8 * fVar48 + fVar7 * fVar90 + fVar5 * fVar45 + fVar6 * fVar60)
                                * fVar124 * fVar124 * 3.0 +
                                (fVar4 * fVar48 +
                                (float)(~uVar142 & (uint)fVar38 |
                                       (uint)(((1.0 - auVar139._12_4_) * fVar66 + fVar66) *
                                             (fVar97 * fVar38 + fVar47 * fVar122)) & uVar142) *
                                fVar90 + (float)(~uVar142 & (uint)fVar39 |
                                                (uint)(((1.0 - auVar113._12_4_ * fVar132) * fVar132
                                                       + fVar132) *
                                                      (fVar49 * fVar61 + fVar122 * fVar39)) &
                                                uVar142) * fVar45 + fVar2 * fVar60) *
                                (fVar43 - fVar124 * fVar124) * 3.0 +
                               (fVar3 * fVar48 +
                               (float)(~uVar142 & (uint)fVar36 |
                                      (uint)(((1.0 - auVar94._12_4_) * fVar75 + fVar75) *
                                            (fVar41 * fVar97 + fVar64 * fVar36)) & uVar142) * fVar90
                               + auVar151._12_4_ * fVar45 + fVar123 * fVar60) *
                               (fVar73 * fVar73 - fVar43) * 3.0) -
                              (fVar91 * fVar48 + fVar87 * fVar90 + fVar77 * fVar45 + fVar83 * fVar60
                              ) * fVar73 * fVar73 * 3.0) * dscale) & uVar15;
          sVar25 = sVar25 + 1;
          puVar29 = puVar29 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
      in_XMM8 = _DAT_01feca10;
      fVar112 = (float)DAT_01feca10;
      fVar118 = DAT_01feca10._4_4_;
      fVar120 = DAT_01feca10._8_4_;
      fVar124 = DAT_01feca10._12_4_;
      if (RVar21.ptr != 0) {
        fVar76 = (v->field_0).v[0];
        fVar82 = (v->field_0).v[1];
        fVar86 = (v->field_0).v[2];
        fVar90 = (v->field_0).v[3];
        fVar42 = fVar112 - fVar76;
        fVar44 = fVar118 - fVar82;
        fVar46 = fVar120 - fVar86;
        fVar48 = fVar124 - fVar90;
        fVar36 = *(float *)depth;
        fVar38 = *(float *)(depth + 4);
        fVar39 = *(float *)(depth + 8);
        fVar41 = *(float *)(depth + 0xc);
        fVar50 = fVar112 - fVar36;
        fVar58 = fVar118 - fVar38;
        fVar65 = fVar120 - fVar39;
        fVar70 = fVar124 - fVar41;
        fVar78 = fVar36 * fVar50 + fVar36 * fVar50;
        fVar79 = fVar38 * fVar58 + fVar38 * fVar58;
        fVar84 = fVar39 * fVar65 + fVar39 * fVar65;
        fVar85 = fVar41 * fVar70 + fVar41 * fVar70;
        fVar56 = fVar50 * fVar50 * -3.0;
        fVar60 = fVar58 * fVar58 * -3.0;
        fVar69 = fVar65 * fVar65 * -3.0;
        fVar73 = fVar70 * fVar70 * -3.0;
        fVar88 = (fVar50 * fVar50 - fVar78) * 3.0;
        fVar89 = (fVar58 * fVar58 - fVar79) * 3.0;
        fVar43 = (fVar65 * fVar65 - fVar84) * 3.0;
        fVar45 = (fVar70 * fVar70 - fVar85) * 3.0;
        fVar50 = (fVar78 - fVar36 * fVar36) * 3.0;
        fVar58 = (fVar79 - fVar38 * fVar38) * 3.0;
        fVar65 = (fVar84 - fVar39 * fVar39) * 3.0;
        fVar70 = (fVar85 - fVar41 * fVar41) * 3.0;
        fVar36 = fVar36 * fVar36 * 3.0;
        fVar38 = fVar38 * fVar38 * 3.0;
        fVar39 = fVar39 * fVar39 * 3.0;
        fVar41 = fVar41 * fVar41 * 3.0;
        sVar25 = 0;
        do {
          fVar62 = (v->field_0).v[0];
          fVar64 = (v->field_0).v[1];
          fVar92 = (v->field_0).v[2];
          fVar95 = (v->field_0).v[3];
          fVar96 = *(float *)depth;
          fVar97 = *(float *)(depth + 4);
          fVar51 = *(float *)(depth + 8);
          fVar57 = *(float *)(depth + 0xc);
          fVar78 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar79 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar84 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar85 = *(float *)(uVar22 + 0x100 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x110 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x130 + sVar25 * 4);
          fVar98 = fVar112 - fVar62;
          fVar111 = fVar118 - fVar64;
          fVar119 = fVar120 - fVar92;
          fVar109 = fVar124 - fVar95;
          fVar59 = fVar112 - fVar96;
          fVar61 = fVar118 - fVar97;
          fVar71 = fVar120 - fVar51;
          fVar74 = fVar124 - fVar57;
          uVar136 = -(uint)((fVar62 != 0.0 && fVar62 != fVar112) &&
                           (fVar96 != 0.0 && fVar96 != fVar112));
          uVar140 = -(uint)((fVar64 != 0.0 && fVar64 != fVar118) &&
                           (fVar97 != 0.0 && fVar97 != fVar118));
          uVar141 = -(uint)((fVar92 != 0.0 && fVar92 != fVar120) &&
                           (fVar51 != 0.0 && fVar51 != fVar120));
          uVar142 = -(uint)((fVar95 != 0.0 && fVar95 != fVar124) &&
                           (fVar57 != 0.0 && fVar57 != fVar124));
          auVar52._0_4_ = fVar62 + fVar96;
          auVar52._4_4_ = fVar64 + fVar97;
          auVar52._8_4_ = fVar92 + fVar51;
          auVar52._12_4_ = fVar95 + fVar57;
          auVar99 = rcpps(in_XMM9,auVar52);
          fVar110 = auVar99._0_4_;
          fVar143 = auVar99._4_4_;
          fVar149 = auVar99._8_4_;
          fVar129 = auVar99._12_4_;
          auVar80._0_4_ = fVar98 + fVar96;
          auVar80._4_4_ = fVar111 + fVar97;
          auVar80._8_4_ = fVar119 + fVar51;
          auVar80._12_4_ = fVar109 + fVar57;
          in_XMM9 = rcpps(auVar99,auVar80);
          fVar132 = in_XMM9._0_4_;
          fVar148 = in_XMM9._4_4_;
          fVar150 = in_XMM9._8_4_;
          fVar130 = in_XMM9._12_4_;
          auVar81._0_4_ = fVar98 * fVar84;
          auVar81._4_4_ = fVar111 * fVar84;
          auVar81._8_4_ = fVar119 * fVar84;
          auVar81._12_4_ = fVar109 * fVar84;
          auVar101._0_4_ = fVar98 + fVar59;
          auVar101._4_4_ = fVar111 + fVar61;
          auVar101._8_4_ = fVar119 + fVar71;
          auVar101._12_4_ = fVar109 + fVar74;
          auVar99 = rcpps(auVar81,auVar101);
          fVar121 = auVar99._0_4_;
          auVar102._0_4_ = auVar101._0_4_ * fVar121;
          fVar66 = auVar99._4_4_;
          auVar102._4_4_ = auVar101._4_4_ * fVar66;
          fVar125 = auVar99._8_4_;
          auVar102._8_4_ = auVar101._8_4_ * fVar125;
          fVar72 = auVar99._12_4_;
          auVar102._12_4_ = auVar101._12_4_ * fVar72;
          fVar77 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0x120 + sVar25 * 4);
          auVar153._0_4_ = fVar62 + fVar59;
          auVar153._4_4_ = fVar64 + fVar61;
          auVar153._8_4_ = fVar92 + fVar71;
          auVar153._12_4_ = fVar95 + fVar74;
          auVar99 = rcpps(auVar102,auVar153);
          fVar75 = auVar99._0_4_;
          fVar117 = auVar99._4_4_;
          fVar122 = auVar99._8_4_;
          fVar108 = auVar99._12_4_;
          fVar87 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar5 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar6 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar7 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar8 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          fVar9 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar10 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar28 = ~*(uint *)This.ptr & *puVar28 |
                     (uint)(((fVar10 * fVar56 + fVar9 * fVar88 + fVar7 * fVar50 + fVar8 * fVar36) *
                             fVar76 * fVar76 * fVar76 +
                             (fVar6 * fVar56 +
                             (float)(~uVar136 & (uint)fVar79 |
                                    (uint)(((fVar112 - auVar80._0_4_ * fVar132) * fVar132 + fVar132)
                                          * (fVar96 * fVar79 + fVar47 * fVar98)) & uVar136) * fVar88
                             + (float)(~uVar136 & (uint)fVar84 |
                                      (uint)(((fVar112 - auVar102._0_4_) * fVar121 + fVar121) *
                                            (fVar49 * fVar59 + auVar81._0_4_)) & uVar136) * fVar50 +
                               fVar4 * fVar36) * fVar76 * fVar76 * 3.0 * fVar42 +
                             (fVar5 * fVar56 +
                             (float)(~uVar136 & (uint)fVar78 |
                                    (uint)(((fVar112 - auVar52._0_4_ * fVar110) * fVar110 + fVar110)
                                          * (fVar85 * fVar96 + fVar62 * fVar78)) & uVar136) * fVar88
                             + (float)(~uVar136 & (uint)fVar77 |
                                      (uint)(((fVar112 - auVar153._0_4_ * fVar75) * fVar75 + fVar75)
                                            * (fVar59 * fVar77 + fVar83 * fVar62)) & uVar136) *
                               fVar50 + fVar3 * fVar36) * fVar76 * 3.0 * fVar42 * fVar42 +
                            (fVar2 * fVar56 + fVar123 * fVar88 + fVar87 * fVar50 + fVar91 * fVar36)
                            * fVar42 * fVar42 * fVar42) * dscale) & *(uint *)This.ptr;
          puVar28[1] = ~uVar11 & puVar28[1] |
                       (uint)(((fVar10 * fVar60 + fVar9 * fVar89 + fVar7 * fVar58 + fVar8 * fVar38)
                               * fVar82 * fVar82 * fVar82 +
                               (fVar6 * fVar60 +
                               (float)(~uVar140 & (uint)fVar79 |
                                      (uint)(((fVar118 - auVar80._4_4_ * fVar148) * fVar148 +
                                             fVar148) * (fVar97 * fVar79 + fVar47 * fVar111)) &
                                      uVar140) * fVar89 +
                               (float)(~uVar140 & (uint)fVar84 |
                                      (uint)(((fVar118 - auVar102._4_4_) * fVar66 + fVar66) *
                                            (fVar49 * fVar61 + auVar81._4_4_)) & uVar140) * fVar58 +
                               fVar4 * fVar38) * fVar82 * fVar82 * 3.0 * fVar44 +
                               (fVar5 * fVar60 +
                               (float)(~uVar140 & (uint)fVar78 |
                                      (uint)(((fVar118 - auVar52._4_4_ * fVar143) * fVar143 +
                                             fVar143) * (fVar85 * fVar97 + fVar64 * fVar78)) &
                                      uVar140) * fVar89 +
                               (float)(~uVar140 & (uint)fVar77 |
                                      (uint)(((fVar118 - auVar153._4_4_ * fVar117) * fVar117 +
                                             fVar117) * (fVar61 * fVar77 + fVar83 * fVar64)) &
                                      uVar140) * fVar58 + fVar3 * fVar38) *
                               fVar82 * 3.0 * fVar44 * fVar44 +
                              (fVar2 * fVar60 + fVar123 * fVar89 + fVar87 * fVar58 + fVar91 * fVar38
                              ) * fVar44 * fVar44 * fVar44) * dscale) & uVar11;
          puVar28[2] = ~uVar14 & puVar28[2] |
                       (uint)(((fVar10 * fVar69 + fVar9 * fVar43 + fVar7 * fVar65 + fVar8 * fVar39)
                               * fVar86 * fVar86 * fVar86 +
                               (fVar6 * fVar69 +
                               (float)(~uVar141 & (uint)fVar79 |
                                      (uint)(((fVar120 - auVar80._8_4_ * fVar150) * fVar150 +
                                             fVar150) * (fVar51 * fVar79 + fVar47 * fVar119)) &
                                      uVar141) * fVar43 +
                               (float)(~uVar141 & (uint)fVar84 |
                                      (uint)(((fVar120 - auVar102._8_4_) * fVar125 + fVar125) *
                                            (fVar49 * fVar71 + auVar81._8_4_)) & uVar141) * fVar65 +
                               fVar4 * fVar39) * fVar86 * fVar86 * 3.0 * fVar46 +
                               (fVar5 * fVar69 +
                               (float)(~uVar141 & (uint)fVar78 |
                                      (uint)(((fVar120 - auVar52._8_4_ * fVar149) * fVar149 +
                                             fVar149) * (fVar85 * fVar51 + fVar92 * fVar78)) &
                                      uVar141) * fVar43 +
                               (float)(~uVar141 & (uint)fVar77 |
                                      (uint)(((fVar120 - auVar153._8_4_ * fVar122) * fVar122 +
                                             fVar122) * (fVar71 * fVar77 + fVar83 * fVar92)) &
                                      uVar141) * fVar65 + fVar3 * fVar39) *
                               fVar86 * 3.0 * fVar46 * fVar46 +
                              (fVar2 * fVar69 + fVar123 * fVar43 + fVar87 * fVar65 + fVar91 * fVar39
                              ) * fVar46 * fVar46 * fVar46) * dscale) & uVar14;
          puVar28[3] = ~uVar15 & puVar28[3] |
                       (uint)(((fVar10 * fVar73 + fVar9 * fVar45 + fVar7 * fVar70 + fVar8 * fVar41)
                               * fVar90 * fVar90 * fVar90 +
                               (fVar6 * fVar73 +
                               (float)(~uVar142 & (uint)fVar79 |
                                      (uint)(((fVar124 - auVar80._12_4_ * fVar130) * fVar130 +
                                             fVar130) * (fVar57 * fVar79 + fVar47 * fVar109)) &
                                      uVar142) * fVar45 +
                               (float)(~uVar142 & (uint)fVar84 |
                                      (uint)(((fVar124 - auVar102._12_4_) * fVar72 + fVar72) *
                                            (fVar49 * fVar74 + auVar81._12_4_)) & uVar142) * fVar70
                               + fVar4 * fVar41) * fVar90 * fVar90 * 3.0 * fVar48 +
                               (fVar5 * fVar73 +
                               (float)(~uVar142 & (uint)fVar78 |
                                      (uint)(((fVar124 - auVar52._12_4_ * fVar129) * fVar129 +
                                             fVar129) * (fVar85 * fVar57 + fVar95 * fVar78)) &
                                      uVar142) * fVar45 +
                               (float)(~uVar142 & (uint)fVar77 |
                                      (uint)(((fVar124 - auVar153._12_4_ * fVar108) * fVar108 +
                                             fVar108) * (fVar74 * fVar77 + fVar83 * fVar95)) &
                                      uVar142) * fVar70 + fVar3 * fVar41) *
                               fVar90 * 3.0 * fVar48 * fVar48 +
                              (fVar2 * fVar73 + fVar123 * fVar45 + fVar87 * fVar70 + fVar91 * fVar41
                              ) * fVar48 * fVar48 * fVar48) * dscale) & uVar15;
          sVar25 = sVar25 + 1;
          puVar28 = puVar28 + lVar20;
        } while (RVar21.ptr != sVar25);
      }
    }
    if (puVar27 != (uint *)0x0) {
      auVar99 = _DAT_01feca10;
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar50 = (float)DAT_01feca10 - fVar112;
        fVar58 = DAT_01feca10._4_4_ - fVar118;
        fVar65 = DAT_01feca10._8_4_ - fVar120;
        fVar70 = DAT_01feca10._12_4_ - fVar124;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = (float)DAT_01feca10 - fVar76;
        fVar38 = DAT_01feca10._4_4_ - fVar82;
        fVar39 = DAT_01feca10._8_4_ - fVar86;
        fVar41 = DAT_01feca10._12_4_ - fVar90;
        fVar42 = fVar76 * fVar76 * fVar76;
        fVar44 = fVar82 * fVar82 * fVar82;
        fVar46 = fVar86 * fVar86 * fVar86;
        fVar48 = fVar90 * fVar90 * fVar90;
        fVar78 = fVar76 * fVar76 * 3.0 * fVar36;
        fVar79 = fVar82 * fVar82 * 3.0 * fVar38;
        fVar84 = fVar86 * fVar86 * 3.0 * fVar39;
        fVar85 = fVar90 * fVar90 * 3.0 * fVar41;
        fVar56 = fVar36 * fVar36 * fVar36;
        fVar60 = fVar38 * fVar38 * fVar38;
        fVar69 = fVar39 * fVar39 * fVar39;
        fVar73 = fVar41 * fVar41 * fVar41;
        fVar36 = fVar76 * 3.0 * fVar36 * fVar36;
        fVar82 = fVar82 * 3.0 * fVar38 * fVar38;
        fVar86 = fVar86 * 3.0 * fVar39 * fVar39;
        fVar90 = fVar90 * 3.0 * fVar41 * fVar41;
        fVar76 = dscale * dscale;
        sVar25 = 0;
        auVar63 = _DAT_01feca10;
        do {
          auVar99 = _DAT_01feca10;
          fVar5 = (v->field_0).v[0];
          fVar6 = (v->field_0).v[1];
          fVar7 = (v->field_0).v[2];
          fVar8 = (v->field_0).v[3];
          fVar9 = *(float *)depth;
          fVar10 = *(float *)(depth + 4);
          fVar62 = *(float *)(depth + 8);
          fVar64 = *(float *)(depth + 0xc);
          fVar38 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar39 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar41 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar88 = *(float *)(uVar22 + 0x100 + sVar25 * 4);
          fVar89 = *(float *)(uVar22 + 0x110 + sVar25 * 4);
          fVar43 = *(float *)(uVar22 + 0x130 + sVar25 * 4);
          fVar125 = 1.0 - fVar5;
          fVar98 = 1.0 - fVar6;
          fVar111 = 1.0 - fVar7;
          fVar119 = 1.0 - fVar8;
          fVar92 = 1.0 - fVar9;
          fVar95 = 1.0 - fVar10;
          fVar96 = 1.0 - fVar62;
          fVar97 = 1.0 - fVar64;
          uVar136 = -(uint)((fVar5 != 0.0 && fVar5 != auVar63._0_4_) &&
                           (fVar9 != 0.0 && fVar9 != auVar63._0_4_));
          uVar140 = -(uint)((fVar6 != 0.0 && fVar6 != auVar63._4_4_) &&
                           (fVar10 != 0.0 && fVar10 != auVar63._4_4_));
          uVar141 = -(uint)((fVar7 != 0.0 && fVar7 != auVar63._8_4_) &&
                           (fVar62 != 0.0 && fVar62 != auVar63._8_4_));
          uVar142 = -(uint)((fVar8 != 0.0 && fVar8 != auVar63._12_4_) &&
                           (fVar64 != 0.0 && fVar64 != auVar63._12_4_));
          auVar103._0_4_ = fVar5 + fVar9;
          auVar103._4_4_ = fVar6 + fVar10;
          auVar103._8_4_ = fVar7 + fVar62;
          auVar103._12_4_ = fVar8 + fVar64;
          auVar63 = rcpps(in_XMM8,auVar103);
          fVar71 = auVar63._0_4_;
          auVar104._0_4_ = auVar103._0_4_ * fVar71;
          fVar74 = auVar63._4_4_;
          auVar104._4_4_ = auVar103._4_4_ * fVar74;
          fVar121 = auVar63._8_4_;
          auVar104._8_4_ = auVar103._8_4_ * fVar121;
          fVar66 = auVar63._12_4_;
          auVar104._12_4_ = auVar103._12_4_ * fVar66;
          auVar146._0_4_ = fVar125 + fVar9;
          auVar146._4_4_ = fVar98 + fVar10;
          auVar146._8_4_ = fVar111 + fVar62;
          auVar146._12_4_ = fVar119 + fVar64;
          auVar63 = rcpps(auVar104,auVar146);
          fVar51 = auVar63._0_4_;
          auVar147._0_4_ = auVar146._0_4_ * fVar51;
          fVar57 = auVar63._4_4_;
          auVar147._4_4_ = auVar146._4_4_ * fVar57;
          fVar59 = auVar63._8_4_;
          auVar147._8_4_ = auVar146._8_4_ * fVar59;
          fVar61 = auVar63._12_4_;
          auVar147._12_4_ = auVar146._12_4_ * fVar61;
          auVar126._0_4_ = fVar125 + fVar92;
          auVar126._4_4_ = fVar98 + fVar95;
          auVar126._8_4_ = fVar111 + fVar96;
          auVar126._12_4_ = fVar119 + fVar97;
          auVar63 = rcpps(auVar147,auVar126);
          fVar49 = auVar63._0_4_;
          fVar77 = auVar63._4_4_;
          fVar83 = auVar63._8_4_;
          fVar87 = auVar63._12_4_;
          fVar45 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x120 + sVar25 * 4);
          auVar127._0_4_ = fVar47 * fVar5;
          auVar127._4_4_ = fVar47 * fVar6;
          auVar127._8_4_ = fVar47 * fVar7;
          auVar127._12_4_ = fVar47 * fVar8;
          auVar156._0_4_ = fVar5 + fVar92;
          auVar156._4_4_ = fVar6 + fVar95;
          auVar156._8_4_ = fVar7 + fVar96;
          auVar156._12_4_ = fVar8 + fVar97;
          auVar63 = rcpps(auVar127,auVar156);
          fVar72 = auVar63._0_4_;
          fVar75 = auVar63._4_4_;
          fVar117 = auVar63._8_4_;
          fVar122 = auVar63._12_4_;
          auVar53._0_4_ = ~uVar136 & (uint)fVar41;
          auVar53._4_4_ = ~uVar140 & (uint)fVar41;
          auVar53._8_4_ = ~uVar141 & (uint)fVar41;
          auVar53._12_4_ = ~uVar142 & (uint)fVar41;
          in_XMM8._0_4_ =
               (uint)(((1.0 - auVar126._0_4_ * fVar49) * fVar49 + fVar49) *
                     (fVar43 * fVar92 + fVar125 * fVar41)) & uVar136;
          in_XMM8._4_4_ =
               (uint)(((1.0 - auVar126._4_4_ * fVar77) * fVar77 + fVar77) *
                     (fVar43 * fVar95 + fVar98 * fVar41)) & uVar140;
          in_XMM8._8_4_ =
               (uint)(((1.0 - auVar126._8_4_ * fVar83) * fVar83 + fVar83) *
                     (fVar43 * fVar96 + fVar111 * fVar41)) & uVar141;
          in_XMM8._12_4_ =
               (uint)(((1.0 - auVar126._12_4_ * fVar87) * fVar87 + fVar87) *
                     (fVar43 * fVar97 + fVar119 * fVar41)) & uVar142;
          auVar53 = auVar53 | in_XMM8;
          fVar41 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar43 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar27 = ~*(uint *)This.ptr & *puVar27 |
                     (uint)(((fVar4 * fVar56 + fVar3 * fVar36 + fVar123 * fVar78 + fVar2 * fVar42) *
                             fVar112 * 6.0 +
                             (fVar91 * fVar56 +
                             (float)(~uVar136 & (uint)fVar39 |
                                    (uint)(((1.0 - auVar147._0_4_) * fVar51 + fVar51) *
                                          (fVar9 * fVar39 + fVar89 * fVar125)) & uVar136) * fVar36 +
                             auVar53._0_4_ * fVar78 + fVar83 * fVar42) *
                             (fVar50 - (fVar112 + fVar112)) * 6.0 +
                             (fVar87 * fVar56 +
                             (float)(~uVar136 & (uint)fVar38 |
                                    (uint)(((1.0 - auVar104._0_4_) * fVar71 + fVar71) *
                                          (fVar88 * fVar9 + fVar5 * fVar38)) & uVar136) * fVar36 +
                             (float)(~uVar136 & (uint)fVar45 |
                                    (uint)(((1.0 - auVar156._0_4_ * fVar72) * fVar72 + fVar72) *
                                          (fVar92 * fVar45 + auVar127._0_4_)) & uVar136) * fVar78 +
                             fVar77 * fVar42) * (fVar112 - (fVar50 + fVar50)) * 6.0 +
                            (fVar49 * fVar56 + fVar47 * fVar36 + fVar41 * fVar78 + fVar43 * fVar42)
                            * fVar50 * 6.0) * fVar76) & *(uint *)This.ptr;
          puVar27[1] = ~uVar11 & puVar27[1] |
                       (uint)(((fVar4 * fVar60 + fVar3 * fVar82 + fVar123 * fVar79 + fVar2 * fVar44)
                               * fVar118 * 6.0 +
                               (fVar91 * fVar60 +
                               (float)(~uVar140 & (uint)fVar39 |
                                      (uint)(((1.0 - auVar147._4_4_) * fVar57 + fVar57) *
                                            (fVar10 * fVar39 + fVar89 * fVar98)) & uVar140) * fVar82
                               + auVar53._4_4_ * fVar79 + fVar83 * fVar44) *
                               (fVar58 - (fVar118 + fVar118)) * 6.0 +
                               (fVar87 * fVar60 +
                               (float)(~uVar140 & (uint)fVar38 |
                                      (uint)(((1.0 - auVar104._4_4_) * fVar74 + fVar74) *
                                            (fVar88 * fVar10 + fVar6 * fVar38)) & uVar140) * fVar82
                               + (float)(~uVar140 & (uint)fVar45 |
                                        (uint)(((1.0 - auVar156._4_4_ * fVar75) * fVar75 + fVar75) *
                                              (fVar95 * fVar45 + auVar127._4_4_)) & uVar140) *
                                 fVar79 + fVar77 * fVar44) * (fVar118 - (fVar58 + fVar58)) * 6.0 +
                              (fVar49 * fVar60 + fVar47 * fVar82 + fVar41 * fVar79 + fVar43 * fVar44
                              ) * fVar58 * 6.0) * fVar76) & uVar11;
          puVar27[2] = ~uVar14 & puVar27[2] |
                       (uint)(((fVar4 * fVar69 + fVar3 * fVar86 + fVar123 * fVar84 + fVar2 * fVar46)
                               * fVar120 * 6.0 +
                               (fVar91 * fVar69 +
                               (float)(~uVar141 & (uint)fVar39 |
                                      (uint)(((1.0 - auVar147._8_4_) * fVar59 + fVar59) *
                                            (fVar62 * fVar39 + fVar89 * fVar111)) & uVar141) *
                               fVar86 + auVar53._8_4_ * fVar84 + fVar83 * fVar46) *
                               (fVar65 - (fVar120 + fVar120)) * 6.0 +
                               (fVar87 * fVar69 +
                               (float)(~uVar141 & (uint)fVar38 |
                                      (uint)(((1.0 - auVar104._8_4_) * fVar121 + fVar121) *
                                            (fVar88 * fVar62 + fVar7 * fVar38)) & uVar141) * fVar86
                               + (float)(~uVar141 & (uint)fVar45 |
                                        (uint)(((1.0 - auVar156._8_4_ * fVar117) * fVar117 + fVar117
                                               ) * (fVar96 * fVar45 + auVar127._8_4_)) & uVar141) *
                                 fVar84 + fVar77 * fVar46) * (fVar120 - (fVar65 + fVar65)) * 6.0 +
                              (fVar49 * fVar69 + fVar47 * fVar86 + fVar41 * fVar84 + fVar43 * fVar46
                              ) * fVar65 * 6.0) * fVar76) & uVar14;
          puVar27[3] = ~uVar15 & puVar27[3] |
                       (uint)(((fVar4 * fVar73 + fVar3 * fVar90 + fVar123 * fVar85 + fVar2 * fVar48)
                               * fVar124 * 6.0 +
                               (fVar91 * fVar73 +
                               (float)(~uVar142 & (uint)fVar39 |
                                      (uint)(((1.0 - auVar147._12_4_) * fVar61 + fVar61) *
                                            (fVar64 * fVar39 + fVar89 * fVar119)) & uVar142) *
                               fVar90 + auVar53._12_4_ * fVar85 + fVar83 * fVar48) *
                               (fVar70 - (fVar124 + fVar124)) * 6.0 +
                               (fVar87 * fVar73 +
                               (float)(~uVar142 & (uint)fVar38 |
                                      (uint)(((1.0 - auVar104._12_4_) * fVar66 + fVar66) *
                                            (fVar88 * fVar64 + fVar8 * fVar38)) & uVar142) * fVar90
                               + (float)(~uVar142 & (uint)fVar45 |
                                        (uint)(((1.0 - auVar156._12_4_ * fVar122) * fVar122 +
                                               fVar122) * (fVar97 * fVar45 + auVar127._12_4_)) &
                                        uVar142) * fVar85 + fVar77 * fVar48) *
                               (fVar124 - (fVar70 + fVar70)) * 6.0 +
                              (fVar49 * fVar73 + fVar47 * fVar90 + fVar41 * fVar85 + fVar43 * fVar48
                              ) * fVar70 * 6.0) * fVar76) & uVar15;
          sVar25 = sVar25 + 1;
          puVar27 = puVar27 + lVar20;
          auVar63 = auVar99;
        } while (RVar21.ptr != sVar25);
      }
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar36 = auVar99._0_4_ - fVar112;
        fVar39 = auVar99._4_4_ - fVar118;
        fVar41 = auVar99._8_4_ - fVar120;
        fVar42 = auVar99._12_4_ - fVar124;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar38 = auVar99._0_4_ - fVar76;
        fVar46 = auVar99._4_4_ - fVar82;
        fVar50 = auVar99._8_4_ - fVar86;
        fVar58 = auVar99._12_4_ - fVar90;
        fVar44 = fVar38 * 6.0;
        fVar48 = fVar46 * 6.0;
        fVar56 = fVar50 * 6.0;
        fVar60 = fVar58 * 6.0;
        fVar65 = (fVar76 - (fVar38 + fVar38)) * 6.0;
        fVar69 = (fVar82 - (fVar46 + fVar46)) * 6.0;
        fVar70 = (fVar86 - (fVar50 + fVar50)) * 6.0;
        fVar73 = (fVar90 - (fVar58 + fVar58)) * 6.0;
        fVar78 = (fVar38 - (fVar76 + fVar76)) * 6.0;
        fVar46 = (fVar46 - (fVar82 + fVar82)) * 6.0;
        fVar50 = (fVar50 - (fVar86 + fVar86)) * 6.0;
        fVar58 = (fVar58 - (fVar90 + fVar90)) * 6.0;
        fVar76 = fVar76 * 6.0;
        fVar82 = fVar82 * 6.0;
        fVar86 = fVar86 * 6.0;
        fVar90 = fVar90 * 6.0;
        fVar38 = dscale * dscale;
        sVar25 = 0;
        auVar63 = auVar99;
        do {
          auVar99 = _DAT_01feca10;
          fVar6 = (v->field_0).v[0];
          fVar7 = (v->field_0).v[1];
          fVar8 = (v->field_0).v[2];
          fVar9 = (v->field_0).v[3];
          fVar10 = *(float *)depth;
          fVar62 = *(float *)(depth + 4);
          fVar64 = *(float *)(depth + 8);
          fVar92 = *(float *)(depth + 0xc);
          fVar79 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar45 = auVar63._0_4_;
          fVar47 = auVar63._4_4_;
          fVar49 = auVar63._8_4_;
          fVar77 = auVar63._12_4_;
          fVar84 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar85 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar88 = *(float *)(uVar22 + 0x100 + sVar25 * 4);
          fVar89 = *(float *)(uVar22 + 0x110 + sVar25 * 4);
          fVar43 = *(float *)(uVar22 + 0x130 + sVar25 * 4);
          fVar59 = fVar45 - fVar6;
          fVar71 = fVar47 - fVar7;
          fVar121 = fVar49 - fVar8;
          fVar125 = fVar77 - fVar9;
          fVar143 = fVar45 - fVar10;
          fVar148 = fVar47 - fVar62;
          fVar149 = fVar49 - fVar64;
          fVar150 = fVar77 - fVar92;
          uVar136 = -(uint)((fVar6 != 0.0 && fVar6 != fVar45) && (fVar10 != 0.0 && fVar10 != fVar45)
                           );
          uVar140 = -(uint)((fVar7 != 0.0 && fVar7 != fVar47) && (fVar62 != 0.0 && fVar62 != fVar47)
                           );
          uVar141 = -(uint)((fVar8 != 0.0 && fVar8 != fVar49) && (fVar64 != 0.0 && fVar64 != fVar49)
                           );
          uVar142 = -(uint)((fVar9 != 0.0 && fVar9 != fVar77) && (fVar92 != 0.0 && fVar92 != fVar77)
                           );
          auVar37._0_4_ = fVar6 + fVar10;
          auVar37._4_4_ = fVar7 + fVar62;
          auVar37._8_4_ = fVar8 + fVar64;
          auVar37._12_4_ = fVar9 + fVar92;
          auVar128 = rcpps(auVar63,auVar37);
          fVar98 = auVar128._0_4_;
          fVar111 = auVar128._4_4_;
          fVar122 = auVar128._8_4_;
          fVar108 = auVar128._12_4_;
          auVar105._0_4_ = fVar89 * fVar59;
          auVar105._4_4_ = fVar89 * fVar71;
          auVar105._8_4_ = fVar89 * fVar121;
          auVar105._12_4_ = fVar89 * fVar125;
          auVar54._0_4_ = fVar59 + fVar10;
          auVar54._4_4_ = fVar71 + fVar62;
          auVar54._8_4_ = fVar121 + fVar64;
          auVar54._12_4_ = fVar125 + fVar92;
          auVar63 = rcpps(auVar105,auVar54);
          fVar95 = auVar63._0_4_;
          fVar96 = auVar63._4_4_;
          fVar97 = auVar63._8_4_;
          fVar57 = auVar63._12_4_;
          auVar115._0_4_ = fVar59 + fVar143;
          auVar115._4_4_ = fVar71 + fVar148;
          auVar115._8_4_ = fVar121 + fVar149;
          auVar115._12_4_ = fVar125 + fVar150;
          auVar63 = rcpps(auVar128,auVar115);
          fVar75 = auVar63._0_4_;
          fVar117 = auVar63._4_4_;
          fVar109 = auVar63._8_4_;
          fVar110 = auVar63._12_4_;
          fVar89 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar119 = DAT_01feca10._4_4_;
          fVar132 = DAT_01feca10._12_4_;
          fVar45 = *(float *)(uVar22 + 0x120 + sVar25 * 4);
          auVar116._0_4_ = fVar45 * fVar6;
          auVar116._4_4_ = fVar45 * fVar7;
          auVar116._8_4_ = fVar45 * fVar8;
          auVar116._12_4_ = fVar45 * fVar9;
          auVar155._0_4_ = fVar6 + fVar143;
          auVar155._4_4_ = fVar7 + fVar148;
          auVar155._8_4_ = fVar8 + fVar149;
          auVar155._12_4_ = fVar9 + fVar150;
          auVar63 = rcpps(auVar116,auVar155);
          fVar61 = auVar63._0_4_;
          fVar74 = auVar63._4_4_;
          fVar66 = auVar63._8_4_;
          fVar72 = auVar63._12_4_;
          fVar51 = DAT_01feca10._8_4_;
          fVar45 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + sVar25 * 4);
          fVar83 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar91 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar5 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar35 = ~*(uint *)This.ptr & *puVar35 |
                     (uint)(((fVar5 * fVar44 + fVar4 * fVar65 + fVar2 * fVar78 + fVar3 * fVar76) *
                             fVar112 * fVar112 * fVar112 +
                             (fVar123 * fVar44 +
                             (float)(~uVar136 & (uint)fVar84 |
                                    (uint)(((1.0 - auVar54._0_4_ * fVar95) * fVar95 + fVar95) *
                                          (fVar10 * fVar84 + auVar105._0_4_)) & uVar136) * fVar65 +
                             (float)(~uVar136 & (uint)fVar85 |
                                    (uint)(((1.0 - auVar115._0_4_ * fVar75) * fVar75 + fVar75) *
                                          (fVar43 * fVar143 + fVar59 * fVar85)) & uVar136) * fVar78
                             + fVar87 * fVar76) * fVar112 * fVar112 * 3.0 * fVar36 +
                             (fVar91 * fVar44 +
                             (float)(~uVar136 & (uint)fVar79 |
                                    (uint)(((1.0 - auVar37._0_4_ * fVar98) * fVar98 + fVar98) *
                                          (fVar88 * fVar10 + fVar6 * fVar79)) & uVar136) * fVar65 +
                             (float)(~uVar136 & (uint)fVar89 |
                                    (uint)((((float)DAT_01feca10 - auVar155._0_4_ * fVar61) * fVar61
                                           + fVar61) * (fVar143 * fVar89 + auVar116._0_4_)) &
                                    uVar136) * fVar78 + fVar83 * fVar76) *
                             fVar112 * 3.0 * fVar36 * fVar36 +
                            (fVar77 * fVar44 + fVar49 * fVar65 + fVar45 * fVar78 + fVar47 * fVar76)
                            * fVar36 * fVar36 * fVar36) * fVar38) & *(uint *)This.ptr;
          puVar35[1] = ~uVar11 & puVar35[1] |
                       (uint)(((fVar5 * fVar48 + fVar4 * fVar69 + fVar2 * fVar46 + fVar3 * fVar82) *
                               fVar118 * fVar118 * fVar118 +
                               (fVar123 * fVar48 +
                               (float)(~uVar140 & (uint)fVar84 |
                                      (uint)(((1.0 - auVar54._4_4_ * fVar96) * fVar96 + fVar96) *
                                            (fVar62 * fVar84 + auVar105._4_4_)) & uVar140) * fVar69
                               + (float)(~uVar140 & (uint)fVar85 |
                                        (uint)(((1.0 - auVar115._4_4_ * fVar117) * fVar117 + fVar117
                                               ) * (fVar43 * fVar148 + fVar71 * fVar85)) & uVar140)
                                 * fVar46 + fVar87 * fVar82) * fVar118 * fVar118 * 3.0 * fVar39 +
                               (fVar91 * fVar48 +
                               (float)(~uVar140 & (uint)fVar79 |
                                      (uint)(((1.0 - auVar37._4_4_ * fVar111) * fVar111 + fVar111) *
                                            (fVar88 * fVar62 + fVar7 * fVar79)) & uVar140) * fVar69
                               + (float)(~uVar140 & (uint)fVar89 |
                                        (uint)(((fVar119 - auVar155._4_4_ * fVar74) * fVar74 +
                                               fVar74) * (fVar148 * fVar89 + auVar116._4_4_)) &
                                        uVar140) * fVar46 + fVar83 * fVar82) *
                               fVar118 * 3.0 * fVar39 * fVar39 +
                              (fVar77 * fVar48 + fVar49 * fVar69 + fVar45 * fVar46 + fVar47 * fVar82
                              ) * fVar39 * fVar39 * fVar39) * fVar38) & uVar11;
          puVar35[2] = ~uVar14 & puVar35[2] |
                       (uint)(((fVar5 * fVar56 + fVar4 * fVar70 + fVar2 * fVar50 + fVar3 * fVar86) *
                               fVar120 * fVar120 * fVar120 +
                               (fVar123 * fVar56 +
                               (float)(~uVar141 & (uint)fVar84 |
                                      (uint)(((1.0 - auVar54._8_4_ * fVar97) * fVar97 + fVar97) *
                                            (fVar64 * fVar84 + auVar105._8_4_)) & uVar141) * fVar70
                               + (float)(~uVar141 & (uint)fVar85 |
                                        (uint)(((1.0 - auVar115._8_4_ * fVar109) * fVar109 + fVar109
                                               ) * (fVar43 * fVar149 + fVar121 * fVar85)) & uVar141)
                                 * fVar50 + fVar87 * fVar86) * fVar120 * fVar120 * 3.0 * fVar41 +
                               (fVar91 * fVar56 +
                               (float)(~uVar141 & (uint)fVar79 |
                                      (uint)(((1.0 - auVar37._8_4_ * fVar122) * fVar122 + fVar122) *
                                            (fVar88 * fVar64 + fVar8 * fVar79)) & uVar141) * fVar70
                               + (float)(~uVar141 & (uint)fVar89 |
                                        (uint)(((fVar51 - auVar155._8_4_ * fVar66) * fVar66 + fVar66
                                               ) * (fVar149 * fVar89 + auVar116._8_4_)) & uVar141) *
                                 fVar50 + fVar83 * fVar86) * fVar120 * 3.0 * fVar41 * fVar41 +
                              (fVar77 * fVar56 + fVar49 * fVar70 + fVar45 * fVar50 + fVar47 * fVar86
                              ) * fVar41 * fVar41 * fVar41) * fVar38) & uVar14;
          puVar35[3] = ~uVar15 & puVar35[3] |
                       (uint)(((fVar5 * fVar60 + fVar4 * fVar73 + fVar2 * fVar58 + fVar3 * fVar90) *
                               fVar124 * fVar124 * fVar124 +
                               (fVar123 * fVar60 +
                               (float)(~uVar142 & (uint)fVar84 |
                                      (uint)(((1.0 - auVar54._12_4_ * fVar57) * fVar57 + fVar57) *
                                            (fVar92 * fVar84 + auVar105._12_4_)) & uVar142) * fVar73
                               + (float)(~uVar142 & (uint)fVar85 |
                                        (uint)(((1.0 - auVar115._12_4_ * fVar110) * fVar110 +
                                               fVar110) * (fVar43 * fVar150 + fVar125 * fVar85)) &
                                        uVar142) * fVar58 + fVar87 * fVar90) *
                               fVar124 * fVar124 * 3.0 * fVar42 +
                               (fVar91 * fVar60 +
                               (float)(~uVar142 & (uint)fVar79 |
                                      (uint)(((1.0 - auVar37._12_4_ * fVar108) * fVar108 + fVar108)
                                            * (fVar88 * fVar92 + fVar9 * fVar79)) & uVar142) *
                               fVar73 + (float)(~uVar142 & (uint)fVar89 |
                                               (uint)(((fVar132 - auVar155._12_4_ * fVar72) * fVar72
                                                      + fVar72) *
                                                     (fVar150 * fVar89 + auVar116._12_4_)) & uVar142
                                               ) * fVar58 + fVar83 * fVar90) *
                               fVar124 * 3.0 * fVar42 * fVar42 +
                              (fVar77 * fVar60 + fVar49 * fVar73 + fVar45 * fVar58 + fVar47 * fVar90
                              ) * fVar42 * fVar42 * fVar42) * fVar38) & uVar15;
          sVar25 = sVar25 + 1;
          puVar35 = puVar35 + lVar20;
          auVar63 = auVar99;
        } while (RVar21.ptr != sVar25);
      }
      if (RVar21.ptr != 0) {
        fVar112 = (v->field_0).v[0];
        fVar118 = (v->field_0).v[1];
        fVar120 = (v->field_0).v[2];
        fVar124 = (v->field_0).v[3];
        fVar38 = auVar99._0_4_ - fVar112;
        fVar41 = auVar99._4_4_ - fVar118;
        fVar46 = auVar99._8_4_ - fVar120;
        fVar56 = auVar99._12_4_ - fVar124;
        fVar65 = fVar112 * fVar38 + fVar112 * fVar38;
        fVar70 = fVar118 * fVar41 + fVar118 * fVar41;
        fVar73 = fVar120 * fVar46 + fVar120 * fVar46;
        fVar78 = fVar124 * fVar56 + fVar124 * fVar56;
        fVar76 = *(float *)depth;
        fVar82 = *(float *)(depth + 4);
        fVar86 = *(float *)(depth + 8);
        fVar90 = *(float *)(depth + 0xc);
        fVar36 = auVar99._0_4_ - fVar76;
        fVar42 = auVar99._4_4_ - fVar82;
        fVar48 = auVar99._8_4_ - fVar86;
        fVar58 = auVar99._12_4_ - fVar90;
        fVar79 = fVar76 * fVar36 + fVar76 * fVar36;
        fVar84 = fVar82 * fVar42 + fVar82 * fVar42;
        fVar85 = fVar86 * fVar48 + fVar86 * fVar48;
        fVar88 = fVar90 * fVar58 + fVar90 * fVar58;
        fVar39 = fVar36 * fVar36 * -3.0;
        fVar44 = fVar42 * fVar42 * -3.0;
        fVar50 = fVar48 * fVar48 * -3.0;
        fVar60 = fVar58 * fVar58 * -3.0;
        fVar69 = (fVar36 * fVar36 - fVar79) * 3.0;
        fVar42 = (fVar42 * fVar42 - fVar84) * 3.0;
        fVar48 = (fVar48 * fVar48 - fVar85) * 3.0;
        fVar58 = (fVar58 * fVar58 - fVar88) * 3.0;
        fVar79 = (fVar79 - fVar76 * fVar76) * 3.0;
        fVar84 = (fVar84 - fVar82 * fVar82) * 3.0;
        fVar85 = (fVar85 - fVar86 * fVar86) * 3.0;
        fVar88 = (fVar88 - fVar90 * fVar90) * 3.0;
        fVar36 = fVar76 * fVar76 * 3.0;
        fVar82 = fVar82 * fVar82 * 3.0;
        fVar86 = fVar86 * fVar86 * 3.0;
        fVar90 = fVar90 * fVar90 * 3.0;
        fVar76 = dscale * dscale;
        sVar25 = 0;
        do {
          auVar63 = _DAT_01feca10;
          fVar64 = (v->field_0).v[0];
          fVar92 = (v->field_0).v[1];
          fVar95 = (v->field_0).v[2];
          fVar96 = (v->field_0).v[3];
          fVar97 = *(float *)depth;
          fVar51 = *(float *)(depth + 4);
          fVar57 = *(float *)(depth + 8);
          fVar59 = *(float *)(depth + 0xc);
          fVar89 = *(float *)(uVar22 + 0x50 + sVar25 * 4);
          fVar83 = auVar99._0_4_;
          fVar87 = auVar99._4_4_;
          fVar91 = auVar99._8_4_;
          fVar123 = auVar99._12_4_;
          fVar43 = *(float *)(uVar22 + 0x60 + sVar25 * 4);
          fVar45 = *(float *)(uVar22 + 0xa0 + sVar25 * 4);
          fVar47 = *(float *)(uVar22 + 0x100 + sVar25 * 4);
          fVar49 = *(float *)(uVar22 + 0x110 + sVar25 * 4);
          fVar77 = *(float *)(uVar22 + 0x130 + sVar25 * 4);
          fVar111 = fVar83 - fVar64;
          fVar119 = fVar87 - fVar92;
          fVar109 = fVar91 - fVar95;
          fVar110 = fVar123 - fVar96;
          fVar61 = fVar83 - fVar97;
          fVar71 = fVar87 - fVar51;
          fVar74 = fVar91 - fVar57;
          fVar121 = fVar123 - fVar59;
          uVar136 = -(uint)((fVar64 != 0.0 && fVar64 != fVar83) &&
                           (fVar97 != 0.0 && fVar97 != fVar83));
          uVar140 = -(uint)((fVar92 != 0.0 && fVar92 != fVar87) &&
                           (fVar51 != 0.0 && fVar51 != fVar87));
          uVar141 = -(uint)((fVar95 != 0.0 && fVar95 != fVar91) &&
                           (fVar57 != 0.0 && fVar57 != fVar91));
          uVar142 = -(uint)((fVar96 != 0.0 && fVar96 != fVar123) &&
                           (fVar59 != 0.0 && fVar59 != fVar123));
          auVar55._0_4_ = fVar64 + fVar97;
          auVar55._4_4_ = fVar92 + fVar51;
          auVar55._8_4_ = fVar95 + fVar57;
          auVar55._12_4_ = fVar96 + fVar59;
          auVar99 = rcpps(auVar99,auVar55);
          fVar143 = auVar99._0_4_;
          fVar149 = auVar99._4_4_;
          fVar130 = auVar99._8_4_;
          fVar133 = auVar99._12_4_;
          auVar67._0_4_ = fVar111 + fVar97;
          auVar67._4_4_ = fVar119 + fVar51;
          auVar67._8_4_ = fVar109 + fVar57;
          auVar67._12_4_ = fVar110 + fVar59;
          auVar99 = rcpps(auVar99,auVar67);
          fVar148 = auVar99._0_4_;
          fVar150 = auVar99._4_4_;
          fVar131 = auVar99._8_4_;
          fVar134 = auVar99._12_4_;
          auVar68._0_4_ = fVar111 * fVar45;
          auVar68._4_4_ = fVar119 * fVar45;
          auVar68._8_4_ = fVar109 * fVar45;
          auVar68._12_4_ = fVar110 * fVar45;
          auVar106._0_4_ = fVar111 + fVar61;
          auVar106._4_4_ = fVar119 + fVar71;
          auVar106._8_4_ = fVar109 + fVar74;
          auVar106._12_4_ = fVar110 + fVar121;
          auVar99 = rcpps(auVar68,auVar106);
          fVar66 = auVar99._0_4_;
          auVar107._0_4_ = auVar106._0_4_ * fVar66;
          fVar125 = auVar99._4_4_;
          auVar107._4_4_ = auVar106._4_4_ * fVar125;
          fVar72 = auVar99._8_4_;
          auVar107._8_4_ = auVar106._8_4_ * fVar72;
          fVar75 = auVar99._12_4_;
          auVar107._12_4_ = auVar106._12_4_ * fVar75;
          fVar83 = *(float *)(uVar22 + 0x90 + sVar25 * 4);
          fVar87 = *(float *)(uVar22 + 0x120 + sVar25 * 4);
          auVar152._0_4_ = fVar64 + fVar61;
          auVar152._4_4_ = fVar92 + fVar71;
          auVar152._8_4_ = fVar95 + fVar74;
          auVar152._12_4_ = fVar96 + fVar121;
          auVar99 = rcpps(auVar107,auVar152);
          fVar129 = DAT_01feca10._4_4_;
          fVar135 = DAT_01feca10._12_4_;
          fVar117 = auVar99._0_4_;
          fVar122 = auVar99._4_4_;
          fVar108 = auVar99._8_4_;
          fVar132 = auVar99._12_4_;
          fVar98 = DAT_01feca10._8_4_;
          fVar91 = *(float *)(uVar22 + 0x80 + sVar25 * 4);
          fVar123 = *(float *)(uVar22 + 0xc0 + sVar25 * 4);
          fVar2 = *(float *)(uVar22 + 0x40 + sVar25 * 4);
          fVar3 = *(float *)(uVar22 + sVar25 * 4);
          fVar4 = *(float *)(uVar22 + 0xd0 + sVar25 * 4);
          fVar5 = *(float *)(uVar22 + 0xe0 + sVar25 * 4);
          fVar6 = *(float *)(uVar22 + 0x10 + sVar25 * 4);
          fVar7 = *(float *)(uVar22 + 0x20 + sVar25 * 4);
          fVar8 = *(float *)(uVar22 + 0xb0 + sVar25 * 4);
          fVar9 = *(float *)(uVar22 + 0xf0 + sVar25 * 4);
          fVar10 = *(float *)(uVar22 + 0x70 + sVar25 * 4);
          fVar62 = *(float *)(uVar22 + 0x30 + sVar25 * 4);
          uVar11 = *(uint *)(This.ptr + 4);
          uVar14 = *(uint *)(This.ptr + 8);
          uVar15 = *(uint *)(This.ptr + 0xc);
          *puVar19 = ~*(uint *)This.ptr & *puVar19 |
                     (uint)((((fVar62 * fVar39 + fVar10 * fVar69 + fVar8 * fVar79 + fVar9 * fVar36)
                              * fVar112 * fVar112 * 3.0 +
                              (fVar7 * fVar39 +
                              (float)(~uVar136 & (uint)fVar43 |
                                     (uint)(((1.0 - auVar67._0_4_ * fVar148) * fVar148 + fVar148) *
                                           (fVar97 * fVar43 + fVar49 * fVar111)) & uVar136) * fVar69
                              + (float)(~uVar136 & (uint)fVar45 |
                                       (uint)(((1.0 - auVar107._0_4_) * fVar66 + fVar66) *
                                             (fVar77 * fVar61 + auVar68._0_4_)) & uVar136) * fVar79
                                + fVar5 * fVar36) * (fVar65 - fVar112 * fVar112) * 3.0 +
                             (fVar6 * fVar39 +
                             (float)(~uVar136 & (uint)fVar89 |
                                    (uint)(((1.0 - auVar55._0_4_ * fVar143) * fVar143 + fVar143) *
                                          (fVar47 * fVar97 + fVar64 * fVar89)) & uVar136) * fVar69 +
                             (float)(~uVar136 & (uint)fVar83 |
                                    (uint)((((float)DAT_01feca10 - auVar152._0_4_ * fVar117) *
                                            fVar117 + fVar117) * (fVar61 * fVar83 + fVar87 * fVar64)
                                          ) & uVar136) * fVar79 + fVar4 * fVar36) *
                             (fVar38 * fVar38 - fVar65) * 3.0) -
                            (fVar3 * fVar39 + fVar2 * fVar69 + fVar91 * fVar79 + fVar123 * fVar36) *
                            fVar38 * fVar38 * 3.0) * fVar76) & *(uint *)This.ptr;
          puVar19[1] = ~uVar11 & puVar19[1] |
                       (uint)((((fVar62 * fVar44 + fVar10 * fVar42 + fVar8 * fVar84 + fVar9 * fVar82
                                ) * fVar118 * fVar118 * 3.0 +
                                (fVar7 * fVar44 +
                                (float)(~uVar140 & (uint)fVar43 |
                                       (uint)(((1.0 - auVar67._4_4_ * fVar150) * fVar150 + fVar150)
                                             * (fVar51 * fVar43 + fVar49 * fVar119)) & uVar140) *
                                fVar42 + (float)(~uVar140 & (uint)fVar45 |
                                                (uint)(((1.0 - auVar107._4_4_) * fVar125 + fVar125)
                                                      * (fVar77 * fVar71 + auVar68._4_4_)) & uVar140
                                                ) * fVar84 + fVar5 * fVar82) *
                                (fVar70 - fVar118 * fVar118) * 3.0 +
                               (fVar6 * fVar44 +
                               (float)(~uVar140 & (uint)fVar89 |
                                      (uint)(((1.0 - auVar55._4_4_ * fVar149) * fVar149 + fVar149) *
                                            (fVar47 * fVar51 + fVar92 * fVar89)) & uVar140) * fVar42
                               + (float)(~uVar140 & (uint)fVar83 |
                                        (uint)(((fVar129 - auVar152._4_4_ * fVar122) * fVar122 +
                                               fVar122) * (fVar71 * fVar83 + fVar87 * fVar92)) &
                                        uVar140) * fVar84 + fVar4 * fVar82) *
                               (fVar41 * fVar41 - fVar70) * 3.0) -
                              (fVar3 * fVar44 + fVar2 * fVar42 + fVar91 * fVar84 + fVar123 * fVar82)
                              * fVar41 * fVar41 * 3.0) * fVar76) & uVar11;
          puVar19[2] = ~uVar14 & puVar19[2] |
                       (uint)((((fVar62 * fVar50 + fVar10 * fVar48 + fVar8 * fVar85 + fVar9 * fVar86
                                ) * fVar120 * fVar120 * 3.0 +
                                (fVar7 * fVar50 +
                                (float)(~uVar141 & (uint)fVar43 |
                                       (uint)(((1.0 - auVar67._8_4_ * fVar131) * fVar131 + fVar131)
                                             * (fVar57 * fVar43 + fVar49 * fVar109)) & uVar141) *
                                fVar48 + (float)(~uVar141 & (uint)fVar45 |
                                                (uint)(((1.0 - auVar107._8_4_) * fVar72 + fVar72) *
                                                      (fVar77 * fVar74 + auVar68._8_4_)) & uVar141)
                                         * fVar85 + fVar5 * fVar86) *
                                (fVar73 - fVar120 * fVar120) * 3.0 +
                               (fVar6 * fVar50 +
                               (float)(~uVar141 & (uint)fVar89 |
                                      (uint)(((1.0 - auVar55._8_4_ * fVar130) * fVar130 + fVar130) *
                                            (fVar47 * fVar57 + fVar95 * fVar89)) & uVar141) * fVar48
                               + (float)(~uVar141 & (uint)fVar83 |
                                        (uint)(((fVar98 - auVar152._8_4_ * fVar108) * fVar108 +
                                               fVar108) * (fVar74 * fVar83 + fVar87 * fVar95)) &
                                        uVar141) * fVar85 + fVar4 * fVar86) *
                               (fVar46 * fVar46 - fVar73) * 3.0) -
                              (fVar3 * fVar50 + fVar2 * fVar48 + fVar91 * fVar85 + fVar123 * fVar86)
                              * fVar46 * fVar46 * 3.0) * fVar76) & uVar14;
          puVar19[3] = ~uVar15 & puVar19[3] |
                       (uint)((((fVar62 * fVar60 + fVar10 * fVar58 + fVar8 * fVar88 + fVar9 * fVar90
                                ) * fVar124 * fVar124 * 3.0 +
                                (fVar7 * fVar60 +
                                (float)(~uVar142 & (uint)fVar43 |
                                       (uint)(((1.0 - auVar67._12_4_ * fVar134) * fVar134 + fVar134)
                                             * (fVar59 * fVar43 + fVar49 * fVar110)) & uVar142) *
                                fVar58 + (float)(~uVar142 & (uint)fVar45 |
                                                (uint)(((1.0 - auVar107._12_4_) * fVar75 + fVar75) *
                                                      (fVar77 * fVar121 + auVar68._12_4_)) & uVar142
                                                ) * fVar88 + fVar5 * fVar90) *
                                (fVar78 - fVar124 * fVar124) * 3.0 +
                               (fVar6 * fVar60 +
                               (float)(~uVar142 & (uint)fVar89 |
                                      (uint)(((1.0 - auVar55._12_4_ * fVar133) * fVar133 + fVar133)
                                            * (fVar47 * fVar59 + fVar96 * fVar89)) & uVar142) *
                               fVar58 + (float)(~uVar142 & (uint)fVar83 |
                                               (uint)(((fVar135 - auVar152._12_4_ * fVar132) *
                                                       fVar132 + fVar132) *
                                                     (fVar121 * fVar83 + fVar87 * fVar96)) & uVar142
                                               ) * fVar88 + fVar4 * fVar90) *
                               (fVar56 * fVar56 - fVar78) * 3.0) -
                              (fVar3 * fVar60 + fVar2 * fVar58 + fVar91 * fVar88 + fVar123 * fVar90)
                              * fVar56 * fVar56 * 3.0) * fVar76) & uVar15;
          sVar25 = sVar25 + 1;
          puVar19 = puVar19 + lVar20;
          auVar99 = auVar63;
        } while (RVar21.ptr != sVar25);
      }
    }
LAB_00e3587e:
    pfVar18 = *(float **)This.ptr;
    pfVar40 = *(float **)(This.ptr + 8);
    goto LAB_00e3588a;
  default:
    goto switchD_00e32e6c_caseD_5;
  case 7:
    vVar157 = eval_general(this,valid,(SubdividedGeneralPatch *)This.ptr,
                           (vfloat_impl<4> *)((ulong)u & 0xfffffffffffffff0),v,depth);
    RVar21.ptr = vVar157.field_0._8_8_;
    break;
  case 8:
    vVar157 = eval_quad(this,valid,(SubdividedQuadPatch *)This.ptr,
                        (vfloat_impl<4> *)((ulong)u & 0xfffffffffffffff0),v,dscale,depth);
    RVar21.ptr = vVar157.field_0._8_8_;
    break;
  case 9:
    pDVar26 = &local_d80.ring.items[0].crease_weight;
    lVar20 = 0;
    do {
      *(long *)((long)local_d80.ring.items[0].crease_weight.arr + lVar20 + 0x40) =
           (long)pDVar26->arr + lVar20;
      *(undefined8 *)((long)local_d80.ring.items[0].ring.arr + lVar20 + -0x38) = 0;
      *(long *)((long)&local_d80.ring.items[0].ring.data + lVar20) =
           (long)&local_d80.ring.items[0].ring.arr[0].field_0 + lVar20;
      lVar20 = lVar20 + 0x340;
    } while (lVar20 != 0xd00);
    uVar22 = (ulong)u & 0xfffffffffffffff0;
    lVar24 = 0;
    lVar20 = 0;
    do {
      local_d80.ring.items[lVar24].border_index = *(int *)(uVar22 + lVar20);
      uVar11 = *(uint *)(uVar22 + 4 + lVar20);
      local_d80.ring.items[lVar24].face_valence = uVar11;
      local_d80.ring.items[lVar24].edge_valence = uVar11 * 2;
      local_d80.ring.items[lVar24].vertex_crease_weight = *(float *)(uVar22 + 8 + lVar20);
      lVar32 = lVar20 + 0xc;
      if (uVar11 != 0) {
        uVar34 = 0;
        do {
          if ((0xf < uVar34) &&
             ((DynamicStackArray<float,_16UL,_64UL> *)
              local_d80.ring.items[lVar24].crease_weight.data ==
              &local_d80.ring.items[lVar24].crease_weight)) {
            pfVar18 = (float *)operator_new__(0x100);
            local_d80.ring.items[lVar24].crease_weight.data = pfVar18;
            lVar20 = 0;
            do {
              local_d80.ring.items[lVar24].crease_weight.data[lVar20] = pDVar26->arr[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 0x10);
          }
          local_d80.ring.items[lVar24].crease_weight.data[uVar34] = *(float *)(uVar22 + lVar32);
          uVar34 = uVar34 + 1;
          lVar32 = lVar32 + 4;
        } while (uVar34 < local_d80.ring.items[lVar24].face_valence);
      }
      local_d80.ring.items[lVar24].vertex_level = *(float *)(uVar22 + lVar32);
      local_d80.ring.items[lVar24].edge_level = *(float *)(uVar22 + 4 + lVar32);
      local_d80.ring.items[lVar24].eval_start_index = *(uint *)(uVar22 + 8 + lVar32);
      local_d80.ring.items[lVar24].eval_unique_identifier = *(uint *)(uVar22 + 0xc + lVar32);
      puVar1 = (undefined8 *)(uVar22 + 0x10 + lVar32);
      uVar16 = puVar1[1];
      *(undefined8 *)&local_d80.ring.items[lVar24].vtx.field_0 = *puVar1;
      *(undefined8 *)((long)&local_d80.ring.items[lVar24].vtx.field_0 + 8) = uVar16;
      lVar20 = lVar32 + 0x20;
      if (local_d80.ring.items[lVar24].edge_valence != 0) {
        lVar33 = 0;
        uVar34 = 0;
        do {
          puVar1 = (undefined8 *)(lVar32 + uVar22 + 0x20 + lVar33);
          uVar16 = *puVar1;
          uVar17 = puVar1[1];
          if ((0x1f < uVar34) &&
             ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)
              local_d80.ring.items[lVar24].ring.data == &local_d80.ring.items[lVar24].ring)) {
            alignedMalloc(0x800,0x10);
            PatchEvalSimd<embree::vboolf_impl<4>,embree::vint_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>>
            ::eval();
          }
          uVar34 = uVar34 + 1;
          puVar1 = (undefined8 *)((long)&(local_d80.ring.items[lVar24].ring.data)->field_0 + lVar33)
          ;
          *puVar1 = uVar16;
          puVar1[1] = uVar17;
          lVar33 = lVar33 + 0x10;
        } while (uVar34 < local_d80.ring.items[lVar24].edge_valence);
        lVar20 = lVar20 + lVar33;
      }
      lVar24 = lVar24 + 1;
      pDVar26 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar26 + 6) + 0x40);
    } while (lVar24 != 4);
    local_dc0.P = *(float **)&valid->field_0;
    local_dc0.dPdu = *(float **)((long)&valid->field_0 + 8);
    local_dc0.dPdv = *(float **)&valid[1].field_0;
    local_dc0.ddPdudu = *(float **)((long)&valid[1].field_0 + 8);
    local_dc0.ddPdvdv = *(float **)&valid[2].field_0;
    local_dc0.ddPdudv = *(float **)((long)&valid[2].field_0 + 8);
    local_dc0.dstride = *(size_t *)&valid[3].field_0;
    local_dc0.N = *(size_t *)((long)&valid[3].field_0 + 8);
    local_de0._0_8_ = *(undefined8 *)&v->field_0;
    local_de0._8_8_ = *(undefined8 *)((long)&v->field_0 + 8);
    local_de0._16_8_ = *(undefined8 *)depth;
    local_de0._24_8_ = *(undefined8 *)(depth + 8);
    FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
    ::eval_direct(&local_dc0,(vboolf_impl<4> *)This.ptr,&local_d80,
                  (Vec2<embree::vfloat_impl<4>_> *)&local_de0.field_0,dscale,in_stack_00000008,
                  (BezierCurve *)0x0,(BezierCurve *)0x0,(BezierCurve *)0x0,(BezierCurve *)0x0);
    pfVar18 = *(float **)(This.ptr + 8);
    this->P = *(float **)This.ptr;
    this->dPdu = pfVar18;
    lVar20 = -0xd00;
    pDVar26 = &local_d80.ring.items[3].crease_weight;
    RVar21.ptr = extraout_RDX_00;
    do {
      ptr = *(vfloat_impl<4> **)((vfloat_impl<4> *)(pDVar26 + 5) + 4);
      if (ptr != (vfloat_impl<4> *)0x0 &&
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)((long)(pDVar26 + 1) + 0x40) !=
          (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)ptr) {
        alignedFree(ptr);
        RVar21.ptr = extraout_RDX_01;
      }
      pfVar18 = pDVar26->data;
      if (pfVar18 != (float *)0x0 && pDVar26 != (DynamicStackArray<float,_16UL,_64UL> *)pfVar18) {
        operator_delete__(pfVar18);
        RVar21.ptr = extraout_RDX_02;
      }
      pDVar26 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar26 + -7) + 0x40);
      lVar20 = lVar20 + 0x340;
    } while (lVar20 != 0);
  }
  vVar157.field_0._8_8_ = RVar21.ptr;
  vVar157.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar157.field_0;
}

Assistant:

vbool eval(const vbool& valid, Ref This, const vfloat& u, const vfloat& v, const float dscale, const size_t depth) 
        {
          if (!This) return false;
          switch (This.type()) 
          {
          case Patch::BILINEAR_PATCH: {
            ((typename Patch::BilinearPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N); 
            return valid;
          }
          case Patch::BSPLINE_PATCH: {
            ((typename Patch::BSplinePatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N);
            return valid;
          }
          case Patch::BEZIER_PATCH: {
            ((typename Patch::BezierPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N);
            return valid;
          }
          case Patch::GREGORY_PATCH: {
            ((typename Patch::GregoryPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N); 
            return valid;
          }
          case Patch::SUBDIVIDED_QUAD_PATCH: {
            return eval_quad(valid,((typename Patch::SubdividedQuadPatch*)This.object()),u,v,dscale,depth);
          }
          case Patch::SUBDIVIDED_GENERAL_PATCH: { 
            assert(dscale == 1.0f); 
            return eval_general(valid,((typename Patch::SubdividedGeneralPatch*)This.object()),u,v,depth); 
          }
          case Patch::EVAL_PATCH: { 
            CatmullClarkPatch patch; patch.deserialize(This.object());
            FeatureAdaptiveEvalSimd<vbool,vint,vfloat,Vertex,Vertex_t>(patch,valid,u,v,dscale,depth,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dstride,N);
            return valid;
          }
          default: 
            assert(false); 
            return false;
          }
        }